

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  byte bVar31;
  uint uVar32;
  ulong uVar33;
  uint uVar35;
  long lVar36;
  uint uVar37;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  int iVar100;
  float t1;
  float fVar101;
  undefined1 auVar102 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  undefined4 uVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  vfloat4 b0;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  vfloat4 b0_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  vfloat4 a0_3;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  vfloat4 a0_2;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar194;
  float fVar205;
  float fVar206;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar207;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar222;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  vfloat4 a0;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  vfloat4 a0_1;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  int iVar251;
  undefined1 in_ZMM31 [64];
  undefined1 auVar252 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_489;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  uint auStack_318 [4];
  RTCFilterFunctionNArguments local_308;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint uStack_168;
  float afStack_164 [7];
  RTCHitN local_148 [16];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar34;
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  
  PVar6 = prim[1];
  uVar33 = (ulong)(byte)PVar6;
  fVar210 = *(float *)(prim + uVar33 * 0x19 + 0x12);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar55 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar46 = vinsertps_avx(auVar55,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar44 = vsubps_avx(auVar43,*(undefined1 (*) [16])(prim + uVar33 * 0x19 + 6));
  fVar125 = fVar210 * auVar44._0_4_;
  fVar101 = fVar210 * auVar46._0_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar33 * 4 + 6);
  auVar73 = vpmovsxbd_avx2(auVar43);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar33 * 5 + 6);
  auVar71 = vpmovsxbd_avx2(auVar55);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar33 * 6 + 6);
  auVar72 = vpmovsxbd_avx2(auVar3);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar33 * 0xb + 6);
  auVar82 = vpmovsxbd_avx2(auVar54);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar83 = vpmovsxbd_avx2(auVar53);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar33 + 6);
  auVar84 = vpmovsxbd_avx2(auVar52);
  auVar84 = vcvtdq2ps_avx(auVar84);
  uVar40 = (ulong)(uint)((int)(uVar33 * 9) * 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar40 + 6);
  auVar74 = vpmovsxbd_avx2(auVar4);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar40 + uVar33 + 6);
  auVar77 = vpmovsxbd_avx2(auVar51);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar75 = vcvtdq2ps_avx(auVar77);
  uVar38 = (ulong)(uint)((int)(uVar33 * 5) << 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar38 + 6);
  auVar69 = vpmovsxbd_avx2(auVar5);
  auVar76 = vcvtdq2ps_avx(auVar69);
  auVar133._4_4_ = fVar101;
  auVar133._0_4_ = fVar101;
  auVar133._8_4_ = fVar101;
  auVar133._12_4_ = fVar101;
  auVar133._16_4_ = fVar101;
  auVar133._20_4_ = fVar101;
  auVar133._24_4_ = fVar101;
  auVar133._28_4_ = fVar101;
  auVar243._8_4_ = 1;
  auVar243._0_8_ = 0x100000001;
  auVar243._12_4_ = 1;
  auVar243._16_4_ = 1;
  auVar243._20_4_ = 1;
  auVar243._24_4_ = 1;
  auVar243._28_4_ = 1;
  auVar78 = ZEXT1632(CONCAT412(fVar210 * auVar46._12_4_,
                               CONCAT48(fVar210 * auVar46._8_4_,
                                        CONCAT44(fVar210 * auVar46._4_4_,fVar101))));
  auVar70 = vpermps_avx2(auVar243,auVar78);
  auVar67 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar68 = vpermps_avx512vl(auVar67,auVar78);
  fVar101 = auVar68._0_4_;
  fVar194 = auVar68._4_4_;
  auVar78._4_4_ = fVar194 * auVar72._4_4_;
  auVar78._0_4_ = fVar101 * auVar72._0_4_;
  fVar205 = auVar68._8_4_;
  auVar78._8_4_ = fVar205 * auVar72._8_4_;
  fVar206 = auVar68._12_4_;
  auVar78._12_4_ = fVar206 * auVar72._12_4_;
  fVar103 = auVar68._16_4_;
  auVar78._16_4_ = fVar103 * auVar72._16_4_;
  fVar104 = auVar68._20_4_;
  auVar78._20_4_ = fVar104 * auVar72._20_4_;
  fVar105 = auVar68._24_4_;
  auVar78._24_4_ = fVar105 * auVar72._24_4_;
  auVar78._28_4_ = auVar77._28_4_;
  auVar77._4_4_ = auVar84._4_4_ * fVar194;
  auVar77._0_4_ = auVar84._0_4_ * fVar101;
  auVar77._8_4_ = auVar84._8_4_ * fVar205;
  auVar77._12_4_ = auVar84._12_4_ * fVar206;
  auVar77._16_4_ = auVar84._16_4_ * fVar103;
  auVar77._20_4_ = auVar84._20_4_ * fVar104;
  auVar77._24_4_ = auVar84._24_4_ * fVar105;
  auVar77._28_4_ = auVar69._28_4_;
  auVar69._4_4_ = auVar76._4_4_ * fVar194;
  auVar69._0_4_ = auVar76._0_4_ * fVar101;
  auVar69._8_4_ = auVar76._8_4_ * fVar205;
  auVar69._12_4_ = auVar76._12_4_ * fVar206;
  auVar69._16_4_ = auVar76._16_4_ * fVar103;
  auVar69._20_4_ = auVar76._20_4_ * fVar104;
  auVar69._24_4_ = auVar76._24_4_ * fVar105;
  auVar69._28_4_ = auVar68._28_4_;
  auVar43 = vfmadd231ps_fma(auVar78,auVar70,auVar71);
  auVar55 = vfmadd231ps_fma(auVar77,auVar70,auVar83);
  auVar3 = vfmadd231ps_fma(auVar69,auVar75,auVar70);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar133,auVar73);
  auVar55 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar133,auVar82);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar74,auVar133);
  auVar139._4_4_ = fVar125;
  auVar139._0_4_ = fVar125;
  auVar139._8_4_ = fVar125;
  auVar139._12_4_ = fVar125;
  auVar139._16_4_ = fVar125;
  auVar139._20_4_ = fVar125;
  auVar139._24_4_ = fVar125;
  auVar139._28_4_ = fVar125;
  auVar69 = ZEXT1632(CONCAT412(fVar210 * auVar44._12_4_,
                               CONCAT48(fVar210 * auVar44._8_4_,
                                        CONCAT44(fVar210 * auVar44._4_4_,fVar125))));
  auVar77 = vpermps_avx2(auVar243,auVar69);
  auVar69 = vpermps_avx512vl(auVar67,auVar69);
  auVar70 = vmulps_avx512vl(auVar69,auVar72);
  auVar80._0_4_ = auVar69._0_4_ * auVar84._0_4_;
  auVar80._4_4_ = auVar69._4_4_ * auVar84._4_4_;
  auVar80._8_4_ = auVar69._8_4_ * auVar84._8_4_;
  auVar80._12_4_ = auVar69._12_4_ * auVar84._12_4_;
  auVar80._16_4_ = auVar69._16_4_ * auVar84._16_4_;
  auVar80._20_4_ = auVar69._20_4_ * auVar84._20_4_;
  auVar80._24_4_ = auVar69._24_4_ * auVar84._24_4_;
  auVar80._28_4_ = 0;
  auVar84._4_4_ = auVar69._4_4_ * auVar76._4_4_;
  auVar84._0_4_ = auVar69._0_4_ * auVar76._0_4_;
  auVar84._8_4_ = auVar69._8_4_ * auVar76._8_4_;
  auVar84._12_4_ = auVar69._12_4_ * auVar76._12_4_;
  auVar84._16_4_ = auVar69._16_4_ * auVar76._16_4_;
  auVar84._20_4_ = auVar69._20_4_ * auVar76._20_4_;
  auVar84._24_4_ = auVar69._24_4_ * auVar76._24_4_;
  auVar84._28_4_ = auVar72._28_4_;
  auVar71 = vfmadd231ps_avx512vl(auVar70,auVar77,auVar71);
  auVar54 = vfmadd231ps_fma(auVar80,auVar77,auVar83);
  auVar53 = vfmadd231ps_fma(auVar84,auVar77,auVar75);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar139,auVar73);
  auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar139,auVar82);
  auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar139,auVar74);
  auVar85._8_4_ = 0x7fffffff;
  auVar85._0_8_ = 0x7fffffff7fffffff;
  auVar85._12_4_ = 0x7fffffff;
  auVar85._16_4_ = 0x7fffffff;
  auVar85._20_4_ = 0x7fffffff;
  auVar85._24_4_ = 0x7fffffff;
  auVar85._28_4_ = 0x7fffffff;
  auVar73 = vandps_avx(ZEXT1632(auVar43),auVar85);
  auVar87._8_4_ = 0x219392ef;
  auVar87._0_8_ = 0x219392ef219392ef;
  auVar87._12_4_ = 0x219392ef;
  auVar87._16_4_ = 0x219392ef;
  auVar87._20_4_ = 0x219392ef;
  auVar87._24_4_ = 0x219392ef;
  auVar87._28_4_ = 0x219392ef;
  uVar40 = vcmpps_avx512vl(auVar73,auVar87,1);
  bVar41 = (bool)((byte)uVar40 & 1);
  auVar70._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar43._0_4_;
  bVar41 = (bool)((byte)(uVar40 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar43._4_4_;
  bVar41 = (bool)((byte)(uVar40 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar43._8_4_;
  bVar41 = (bool)((byte)(uVar40 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar43._12_4_;
  auVar70._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * 0x219392ef;
  auVar70._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * 0x219392ef;
  auVar70._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * 0x219392ef;
  auVar70._28_4_ = (uint)(byte)(uVar40 >> 7) * 0x219392ef;
  auVar73 = vandps_avx(ZEXT1632(auVar55),auVar85);
  uVar40 = vcmpps_avx512vl(auVar73,auVar87,1);
  bVar41 = (bool)((byte)uVar40 & 1);
  auVar67._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar55._0_4_;
  bVar41 = (bool)((byte)(uVar40 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar55._4_4_;
  bVar41 = (bool)((byte)(uVar40 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar55._8_4_;
  bVar41 = (bool)((byte)(uVar40 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar55._12_4_;
  auVar67._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * 0x219392ef;
  auVar67._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * 0x219392ef;
  auVar67._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * 0x219392ef;
  auVar67._28_4_ = (uint)(byte)(uVar40 >> 7) * 0x219392ef;
  auVar73 = vandps_avx(ZEXT1632(auVar3),auVar85);
  uVar40 = vcmpps_avx512vl(auVar73,auVar87,1);
  bVar41 = (bool)((byte)uVar40 & 1);
  auVar73._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar3._0_4_;
  bVar41 = (bool)((byte)(uVar40 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar3._4_4_;
  bVar41 = (bool)((byte)(uVar40 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar3._8_4_;
  bVar41 = (bool)((byte)(uVar40 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar3._12_4_;
  auVar73._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * 0x219392ef;
  auVar73._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * 0x219392ef;
  auVar73._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * 0x219392ef;
  auVar73._28_4_ = (uint)(byte)(uVar40 >> 7) * 0x219392ef;
  auVar72 = vrcp14ps_avx512vl(auVar70);
  auVar86._8_4_ = 0x3f800000;
  auVar86._0_8_ = &DAT_3f8000003f800000;
  auVar86._12_4_ = 0x3f800000;
  auVar86._16_4_ = 0x3f800000;
  auVar86._20_4_ = 0x3f800000;
  auVar86._24_4_ = 0x3f800000;
  auVar86._28_4_ = 0x3f800000;
  auVar43 = vfnmadd213ps_fma(auVar70,auVar72,auVar86);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar67);
  auVar55 = vfnmadd213ps_fma(auVar67,auVar72,auVar86);
  auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar72,auVar72);
  auVar72 = vrcp14ps_avx512vl(auVar73);
  auVar3 = vfnmadd213ps_fma(auVar73,auVar72,auVar86);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar72,auVar72);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 * 7 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar72 = vsubps_avx512vl(auVar73,auVar71);
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 * 9 + 6));
  auVar74._4_4_ = auVar43._4_4_ * auVar72._4_4_;
  auVar74._0_4_ = auVar43._0_4_ * auVar72._0_4_;
  auVar74._8_4_ = auVar43._8_4_ * auVar72._8_4_;
  auVar74._12_4_ = auVar43._12_4_ * auVar72._12_4_;
  auVar74._16_4_ = auVar72._16_4_ * 0.0;
  auVar74._20_4_ = auVar72._20_4_ * 0.0;
  auVar74._24_4_ = auVar72._24_4_ * 0.0;
  auVar74._28_4_ = auVar72._28_4_;
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx512vl(auVar73,auVar71);
  auVar81._0_4_ = auVar43._0_4_ * auVar73._0_4_;
  auVar81._4_4_ = auVar43._4_4_ * auVar73._4_4_;
  auVar81._8_4_ = auVar43._8_4_ * auVar73._8_4_;
  auVar81._12_4_ = auVar43._12_4_ * auVar73._12_4_;
  auVar81._16_4_ = auVar73._16_4_ * 0.0;
  auVar81._20_4_ = auVar73._20_4_ * 0.0;
  auVar81._24_4_ = auVar73._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar71 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar6 * 0x10 + uVar33 * -2 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar54));
  auVar75._4_4_ = auVar55._4_4_ * auVar73._4_4_;
  auVar75._0_4_ = auVar55._0_4_ * auVar73._0_4_;
  auVar75._8_4_ = auVar55._8_4_ * auVar73._8_4_;
  auVar75._12_4_ = auVar55._12_4_ * auVar73._12_4_;
  auVar75._16_4_ = auVar73._16_4_ * 0.0;
  auVar75._20_4_ = auVar73._20_4_ * 0.0;
  auVar75._24_4_ = auVar73._24_4_ * 0.0;
  auVar75._28_4_ = auVar73._28_4_;
  auVar73 = vcvtdq2ps_avx(auVar71);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar54));
  auVar79._0_4_ = auVar55._0_4_ * auVar73._0_4_;
  auVar79._4_4_ = auVar55._4_4_ * auVar73._4_4_;
  auVar79._8_4_ = auVar55._8_4_ * auVar73._8_4_;
  auVar79._12_4_ = auVar55._12_4_ * auVar73._12_4_;
  auVar79._16_4_ = auVar73._16_4_ * 0.0;
  auVar79._20_4_ = auVar73._20_4_ * 0.0;
  auVar79._24_4_ = auVar73._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar38 + uVar33 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar53));
  auVar76._4_4_ = auVar73._4_4_ * auVar3._4_4_;
  auVar76._0_4_ = auVar73._0_4_ * auVar3._0_4_;
  auVar76._8_4_ = auVar73._8_4_ * auVar3._8_4_;
  auVar76._12_4_ = auVar73._12_4_ * auVar3._12_4_;
  auVar76._16_4_ = auVar73._16_4_ * 0.0;
  auVar76._20_4_ = auVar73._20_4_ * 0.0;
  auVar76._24_4_ = auVar73._24_4_ * 0.0;
  auVar76._28_4_ = auVar73._28_4_;
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 * 0x17 + 6));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar73 = vsubps_avx(auVar73,ZEXT1632(auVar53));
  auVar68._0_4_ = auVar3._0_4_ * auVar73._0_4_;
  auVar68._4_4_ = auVar3._4_4_ * auVar73._4_4_;
  auVar68._8_4_ = auVar3._8_4_ * auVar73._8_4_;
  auVar68._12_4_ = auVar3._12_4_ * auVar73._12_4_;
  auVar68._16_4_ = auVar73._16_4_ * 0.0;
  auVar68._20_4_ = auVar73._20_4_ * 0.0;
  auVar68._24_4_ = auVar73._24_4_ * 0.0;
  auVar68._28_4_ = 0;
  auVar73 = vpminsd_avx2(auVar74,auVar81);
  auVar71 = vpminsd_avx2(auVar75,auVar79);
  auVar73 = vmaxps_avx(auVar73,auVar71);
  auVar71 = vpminsd_avx2(auVar76,auVar68);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar72._4_4_ = uVar106;
  auVar72._0_4_ = uVar106;
  auVar72._8_4_ = uVar106;
  auVar72._12_4_ = uVar106;
  auVar72._16_4_ = uVar106;
  auVar72._20_4_ = uVar106;
  auVar72._24_4_ = uVar106;
  auVar72._28_4_ = uVar106;
  auVar71 = vmaxps_avx512vl(auVar71,auVar72);
  auVar73 = vmaxps_avx(auVar73,auVar71);
  auVar71._8_4_ = 0x3f7ffffa;
  auVar71._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar71._12_4_ = 0x3f7ffffa;
  auVar71._16_4_ = 0x3f7ffffa;
  auVar71._20_4_ = 0x3f7ffffa;
  auVar71._24_4_ = 0x3f7ffffa;
  auVar71._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar73,auVar71);
  auVar73 = vpmaxsd_avx2(auVar74,auVar81);
  auVar71 = vpmaxsd_avx2(auVar75,auVar79);
  auVar73 = vminps_avx(auVar73,auVar71);
  auVar71 = vpmaxsd_avx2(auVar76,auVar68);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar82._4_4_ = uVar106;
  auVar82._0_4_ = uVar106;
  auVar82._8_4_ = uVar106;
  auVar82._12_4_ = uVar106;
  auVar82._16_4_ = uVar106;
  auVar82._20_4_ = uVar106;
  auVar82._24_4_ = uVar106;
  auVar82._28_4_ = uVar106;
  auVar71 = vminps_avx512vl(auVar71,auVar82);
  auVar73 = vminps_avx(auVar73,auVar71);
  auVar83._8_4_ = 0x3f800003;
  auVar83._0_8_ = 0x3f8000033f800003;
  auVar83._12_4_ = 0x3f800003;
  auVar83._16_4_ = 0x3f800003;
  auVar83._20_4_ = 0x3f800003;
  auVar83._24_4_ = 0x3f800003;
  auVar83._28_4_ = 0x3f800003;
  auVar73 = vmulps_avx512vl(auVar73,auVar83);
  auVar71 = vpbroadcastd_avx512vl();
  uVar17 = vpcmpgtd_avx512vl(auVar71,_DAT_0205a920);
  uVar15 = vcmpps_avx512vl(local_b8,auVar73,2);
  bVar41 = (byte)((byte)uVar15 & (byte)uVar17) == 0;
  local_489 = !bVar41;
  if (bVar41) {
    return local_489;
  }
  uVar40 = (ulong)(byte)((byte)uVar15 & (byte)uVar17);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar250 = ZEXT1664(auVar43);
  local_2d8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar245 = ZEXT1664(auVar43);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar247 = ZEXT1664(auVar43);
  auVar43 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar252 = ZEXT1664(auVar43);
LAB_01dd2190:
  lVar36 = 0;
  for (uVar33 = uVar40; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
    lVar36 = lVar36 + 1;
  }
  uVar39 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar39].ptr;
  uVar33 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar36 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar43 = *(undefined1 (*) [16])(_Var11 + uVar33 * (long)pvVar10);
  auVar55 = *(undefined1 (*) [16])(_Var11 + (uVar33 + 1) * (long)pvVar10);
  auVar3 = *(undefined1 (*) [16])(_Var11 + (uVar33 + 2) * (long)pvVar10);
  auVar54 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar33 + 3));
  lVar36 = *(long *)&pGVar8[1].time_range.upper;
  auVar53 = *(undefined1 (*) [16])(lVar36 + (long)p_Var9 * uVar33);
  auVar52 = *(undefined1 (*) [16])(lVar36 + (long)p_Var9 * (uVar33 + 1));
  auVar4 = *(undefined1 (*) [16])(lVar36 + (long)p_Var9 * (uVar33 + 2));
  uVar40 = uVar40 - 1 & uVar40;
  auVar51 = *(undefined1 (*) [16])(lVar36 + (long)p_Var9 * (uVar33 + 3));
  if (uVar40 != 0) {
    uVar38 = uVar40 - 1 & uVar40;
    for (uVar33 = uVar40; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
    }
    if (uVar38 != 0) {
      for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar108 = auVar250._0_16_;
  auVar44 = vmulps_avx512vl(auVar51,auVar108);
  auVar46 = vfmadd213ps_fma((undefined1  [16])0x0,auVar4,auVar44);
  auVar45._0_4_ = auVar52._0_4_ + auVar46._0_4_;
  auVar45._4_4_ = auVar52._4_4_ + auVar46._4_4_;
  auVar45._8_4_ = auVar52._8_4_ + auVar46._8_4_;
  auVar45._12_4_ = auVar52._12_4_ + auVar46._12_4_;
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar53,auVar108);
  auVar107 = ZEXT816(0) << 0x40;
  auVar48._0_4_ = auVar51._0_4_ * 0.0;
  auVar48._4_4_ = auVar51._4_4_ * 0.0;
  auVar48._8_4_ = auVar51._8_4_ * 0.0;
  auVar48._12_4_ = auVar51._12_4_ * 0.0;
  auVar58 = auVar245._0_16_;
  auVar46 = vfmadd231ps_avx512vl(auVar48,auVar4,auVar58);
  auVar46 = vfmadd231ps_fma(auVar46,auVar52,auVar107);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar53,auVar58);
  auVar48 = vmulps_avx512vl(auVar54,auVar108);
  auVar46 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar3,auVar48);
  auVar233._0_4_ = auVar46._0_4_ + auVar55._0_4_;
  auVar233._4_4_ = auVar46._4_4_ + auVar55._4_4_;
  auVar233._8_4_ = auVar46._8_4_ + auVar55._8_4_;
  auVar233._12_4_ = auVar46._12_4_ + auVar55._12_4_;
  auVar49 = vfmadd231ps_avx512vl(auVar233,auVar43,auVar108);
  auVar237._0_4_ = auVar54._0_4_ * 0.0;
  auVar237._4_4_ = auVar54._4_4_ * 0.0;
  auVar237._8_4_ = auVar54._8_4_ * 0.0;
  auVar237._12_4_ = auVar54._12_4_ * 0.0;
  auVar46 = vfmadd231ps_avx512vl(auVar237,auVar3,auVar58);
  auVar46 = vfmadd231ps_fma(auVar46,auVar55,auVar107);
  auVar50 = vfnmadd231ps_avx512vl(auVar46,auVar43,auVar58);
  auVar56._0_4_ = auVar4._0_4_ + auVar44._0_4_;
  auVar56._4_4_ = auVar4._4_4_ + auVar44._4_4_;
  auVar56._8_4_ = auVar4._8_4_ + auVar44._8_4_;
  auVar56._12_4_ = auVar4._12_4_ + auVar44._12_4_;
  auVar46 = vfmadd231ps_fma(auVar56,auVar52,auVar107);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar53,auVar108);
  auVar51 = vmulps_avx512vl(auVar51,auVar58);
  auVar4 = vfmadd231ps_fma(auVar51,auVar107,auVar4);
  auVar52 = vfnmadd231ps_avx512vl(auVar4,auVar58,auVar52);
  auVar4 = vfmadd231ps_fma(auVar52,auVar107,auVar53);
  auVar184._0_4_ = auVar48._0_4_ + auVar3._0_4_;
  auVar184._4_4_ = auVar48._4_4_ + auVar3._4_4_;
  auVar184._8_4_ = auVar48._8_4_ + auVar3._8_4_;
  auVar184._12_4_ = auVar48._12_4_ + auVar3._12_4_;
  auVar53 = vfmadd231ps_fma(auVar184,auVar55,auVar107);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar43,auVar108);
  auVar54 = vmulps_avx512vl(auVar54,auVar58);
  auVar3 = vfmadd231ps_fma(auVar54,auVar107,auVar3);
  auVar55 = vfnmadd231ps_avx512vl(auVar3,auVar58,auVar55);
  auVar52 = vfmadd231ps_fma(auVar55,auVar107,auVar43);
  auVar43 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar55 = vshufps_avx(auVar49,auVar49,0xc9);
  fVar206 = auVar47._0_4_;
  auVar61._0_4_ = fVar206 * auVar55._0_4_;
  fVar103 = auVar47._4_4_;
  auVar61._4_4_ = fVar103 * auVar55._4_4_;
  fVar104 = auVar47._8_4_;
  auVar61._8_4_ = fVar104 * auVar55._8_4_;
  fVar105 = auVar47._12_4_;
  auVar61._12_4_ = fVar105 * auVar55._12_4_;
  auVar55 = vfmsub231ps_fma(auVar61,auVar43,auVar49);
  auVar3 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar147._0_4_ = fVar206 * auVar55._0_4_;
  auVar147._4_4_ = fVar103 * auVar55._4_4_;
  auVar147._8_4_ = fVar104 * auVar55._8_4_;
  auVar147._12_4_ = fVar105 * auVar55._12_4_;
  auVar43 = vfmsub231ps_fma(auVar147,auVar43,auVar50);
  auVar54 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar55 = vshufps_avx(auVar53,auVar53,0xc9);
  fVar125 = auVar4._0_4_;
  auVar59._0_4_ = fVar125 * auVar55._0_4_;
  fVar207 = auVar4._4_4_;
  auVar59._4_4_ = fVar207 * auVar55._4_4_;
  fVar208 = auVar4._8_4_;
  auVar59._8_4_ = fVar208 * auVar55._8_4_;
  fVar209 = auVar4._12_4_;
  auVar59._12_4_ = fVar209 * auVar55._12_4_;
  auVar55 = vfmsub231ps_fma(auVar59,auVar43,auVar53);
  auVar53 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar55 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar185._0_4_ = auVar55._0_4_ * fVar125;
  auVar185._4_4_ = auVar55._4_4_ * fVar207;
  auVar185._8_4_ = auVar55._8_4_ * fVar208;
  auVar185._12_4_ = auVar55._12_4_ * fVar209;
  auVar43 = vfmsub231ps_fma(auVar185,auVar43,auVar52);
  auVar52 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar43 = vdpps_avx(auVar3,auVar3,0x7f);
  fVar101 = auVar43._0_4_;
  auVar186._4_12_ = ZEXT812(0) << 0x20;
  auVar186._0_4_ = fVar101;
  auVar55 = vrsqrt14ss_avx512f(auVar107,auVar186);
  auVar51 = vmulss_avx512f(auVar55,ZEXT416(0x3fc00000));
  auVar44 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  fVar210 = auVar55._0_4_;
  fVar210 = auVar51._0_4_ + auVar44._0_4_ * fVar210 * fVar210 * fVar210;
  fVar222 = fVar210 * auVar3._0_4_;
  fVar230 = fVar210 * auVar3._4_4_;
  fVar231 = fVar210 * auVar3._8_4_;
  fVar232 = fVar210 * auVar3._12_4_;
  auVar55 = vdpps_avx(auVar3,auVar54,0x7f);
  auVar195._0_4_ = auVar54._0_4_ * fVar101;
  auVar195._4_4_ = auVar54._4_4_ * fVar101;
  auVar195._8_4_ = auVar54._8_4_ * fVar101;
  auVar195._12_4_ = auVar54._12_4_ * fVar101;
  fVar101 = auVar55._0_4_;
  auVar156._0_4_ = fVar101 * auVar3._0_4_;
  auVar156._4_4_ = fVar101 * auVar3._4_4_;
  auVar156._8_4_ = fVar101 * auVar3._8_4_;
  auVar156._12_4_ = fVar101 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar195,auVar156);
  auVar55 = vrcp14ss_avx512f(auVar107,auVar186);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar55,ZEXT416(0x40000000));
  fVar194 = auVar55._0_4_ * auVar43._0_4_;
  auVar43 = vdpps_avx(auVar53,auVar53,0x7f);
  fVar205 = auVar43._0_4_;
  auVar172._4_12_ = ZEXT812(0) << 0x20;
  auVar172._0_4_ = fVar205;
  auVar55 = vrsqrt14ss_avx512f(auVar107,auVar172);
  auVar54 = vmulss_avx512f(auVar55,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
  fVar101 = auVar55._0_4_;
  fVar101 = auVar54._0_4_ + auVar51._0_4_ * fVar101 * fVar101 * fVar101;
  fVar211 = fVar101 * auVar53._0_4_;
  fVar219 = fVar101 * auVar53._4_4_;
  fVar220 = fVar101 * auVar53._8_4_;
  fVar221 = fVar101 * auVar53._12_4_;
  auVar55 = vdpps_avx(auVar53,auVar52,0x7f);
  auVar148._0_4_ = fVar205 * auVar52._0_4_;
  auVar148._4_4_ = fVar205 * auVar52._4_4_;
  auVar148._8_4_ = fVar205 * auVar52._8_4_;
  auVar148._12_4_ = fVar205 * auVar52._12_4_;
  fVar205 = auVar55._0_4_;
  auVar60._0_4_ = fVar205 * auVar53._0_4_;
  auVar60._4_4_ = fVar205 * auVar53._4_4_;
  auVar60._8_4_ = fVar205 * auVar53._8_4_;
  auVar60._12_4_ = fVar205 * auVar53._12_4_;
  auVar54 = vsubps_avx(auVar148,auVar60);
  auVar55 = vrcp14ss_avx512f(auVar107,auVar172);
  auVar43 = vfnmadd213ss_avx512f(auVar43,auVar55,ZEXT416(0x40000000));
  fVar205 = auVar43._0_4_ * auVar55._0_4_;
  auVar43 = vshufps_avx(auVar45,auVar45,0xff);
  auVar173._0_4_ = fVar222 * auVar43._0_4_;
  auVar173._4_4_ = fVar230 * auVar43._4_4_;
  auVar173._8_4_ = fVar231 * auVar43._8_4_;
  auVar173._12_4_ = fVar232 * auVar43._12_4_;
  local_1f8 = vsubps_avx(auVar45,auVar173);
  auVar55 = vshufps_avx(auVar47,auVar47,0xff);
  auVar149._0_4_ = auVar55._0_4_ * fVar222 + auVar43._0_4_ * fVar210 * fVar194 * auVar3._0_4_;
  auVar149._4_4_ = auVar55._4_4_ * fVar230 + auVar43._4_4_ * fVar210 * fVar194 * auVar3._4_4_;
  auVar149._8_4_ = auVar55._8_4_ * fVar231 + auVar43._8_4_ * fVar210 * fVar194 * auVar3._8_4_;
  auVar149._12_4_ = auVar55._12_4_ * fVar232 + auVar43._12_4_ * fVar210 * fVar194 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar47,auVar149);
  local_208._0_4_ = auVar173._0_4_ + auVar45._0_4_;
  local_208._4_4_ = auVar173._4_4_ + auVar45._4_4_;
  fStack_200 = auVar173._8_4_ + auVar45._8_4_;
  fStack_1fc = auVar173._12_4_ + auVar45._12_4_;
  auVar43 = vshufps_avx(auVar46,auVar46,0xff);
  auVar65._0_4_ = fVar211 * auVar43._0_4_;
  auVar65._4_4_ = fVar219 * auVar43._4_4_;
  auVar65._8_4_ = fVar220 * auVar43._8_4_;
  auVar65._12_4_ = fVar221 * auVar43._12_4_;
  local_218 = vsubps_avx(auVar46,auVar65);
  auVar55 = vshufps_avx(auVar4,auVar4,0xff);
  auVar49._0_4_ = auVar55._0_4_ * fVar211 + auVar43._0_4_ * fVar101 * auVar54._0_4_ * fVar205;
  auVar49._4_4_ = auVar55._4_4_ * fVar219 + auVar43._4_4_ * fVar101 * auVar54._4_4_ * fVar205;
  auVar49._8_4_ = auVar55._8_4_ * fVar220 + auVar43._8_4_ * fVar101 * auVar54._8_4_ * fVar205;
  auVar49._12_4_ = auVar55._12_4_ * fVar221 + auVar43._12_4_ * fVar101 * auVar54._12_4_ * fVar205;
  auVar43 = vsubps_avx(auVar4,auVar49);
  _local_228 = vaddps_avx512vl(auVar46,auVar65);
  auVar57._0_4_ = auVar3._0_4_ * 0.33333334;
  auVar57._4_4_ = auVar3._4_4_ * 0.33333334;
  auVar57._8_4_ = auVar3._8_4_ * 0.33333334;
  auVar57._12_4_ = auVar3._12_4_ * 0.33333334;
  local_238 = vaddps_avx512vl(local_1f8,auVar57);
  auVar63._0_4_ = auVar43._0_4_ * 0.33333334;
  auVar63._4_4_ = auVar43._4_4_ * 0.33333334;
  auVar63._8_4_ = auVar43._8_4_ * 0.33333334;
  auVar63._12_4_ = auVar43._12_4_ * 0.33333334;
  local_248 = vsubps_avx512vl(local_218,auVar63);
  auVar46._0_4_ = (fVar206 + auVar149._0_4_) * 0.33333334;
  auVar46._4_4_ = (fVar103 + auVar149._4_4_) * 0.33333334;
  auVar46._8_4_ = (fVar104 + auVar149._8_4_) * 0.33333334;
  auVar46._12_4_ = (fVar105 + auVar149._12_4_) * 0.33333334;
  _local_258 = vaddps_avx512vl(_local_208,auVar46);
  auVar44._0_4_ = (fVar125 + auVar49._0_4_) * 0.33333334;
  auVar44._4_4_ = (fVar207 + auVar49._4_4_) * 0.33333334;
  auVar44._8_4_ = (fVar208 + auVar49._8_4_) * 0.33333334;
  auVar44._12_4_ = (fVar209 + auVar49._12_4_) * 0.33333334;
  _local_268 = vsubps_avx512vl(_local_228,auVar44);
  local_178 = vsubps_avx(local_1f8,auVar5);
  uVar106 = local_178._0_4_;
  auVar58._4_4_ = uVar106;
  auVar58._0_4_ = uVar106;
  auVar58._8_4_ = uVar106;
  auVar58._12_4_ = uVar106;
  auVar43 = vshufps_avx(local_178,local_178,0x55);
  auVar55 = vshufps_avx(local_178,local_178,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar210 = pre->ray_space[k].vz.field_0.m128[0];
  fVar101 = pre->ray_space[k].vz.field_0.m128[1];
  fVar194 = pre->ray_space[k].vz.field_0.m128[2];
  fVar205 = pre->ray_space[k].vz.field_0.m128[3];
  auVar47._0_4_ = fVar210 * auVar55._0_4_;
  auVar47._4_4_ = fVar101 * auVar55._4_4_;
  auVar47._8_4_ = fVar194 * auVar55._8_4_;
  auVar47._12_4_ = fVar205 * auVar55._12_4_;
  auVar43 = vfmadd231ps_fma(auVar47,(undefined1  [16])aVar2,auVar43);
  auVar51 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar58);
  local_188 = vsubps_avx512vl(local_238,auVar5);
  uVar106 = local_188._0_4_;
  auVar64._4_4_ = uVar106;
  auVar64._0_4_ = uVar106;
  auVar64._8_4_ = uVar106;
  auVar64._12_4_ = uVar106;
  auVar43 = vshufps_avx(local_188,local_188,0x55);
  auVar55 = vshufps_avx(local_188,local_188,0xaa);
  auVar66._0_4_ = fVar210 * auVar55._0_4_;
  auVar66._4_4_ = fVar101 * auVar55._4_4_;
  auVar66._8_4_ = fVar194 * auVar55._8_4_;
  auVar66._12_4_ = fVar205 * auVar55._12_4_;
  auVar43 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar2,auVar43);
  auVar46 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar64);
  local_198 = vsubps_avx512vl(local_248,auVar5);
  uVar106 = local_198._0_4_;
  auVar157._4_4_ = uVar106;
  auVar157._0_4_ = uVar106;
  auVar157._8_4_ = uVar106;
  auVar157._12_4_ = uVar106;
  auVar43 = vshufps_avx(local_198,local_198,0x55);
  auVar55 = vshufps_avx(local_198,local_198,0xaa);
  auVar62._0_4_ = fVar210 * auVar55._0_4_;
  auVar62._4_4_ = fVar101 * auVar55._4_4_;
  auVar62._8_4_ = fVar194 * auVar55._8_4_;
  auVar62._12_4_ = fVar205 * auVar55._12_4_;
  auVar43 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar43);
  auVar44 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar157);
  local_1a8 = vsubps_avx(local_218,auVar5);
  uVar106 = local_1a8._0_4_;
  auVar158._4_4_ = uVar106;
  auVar158._0_4_ = uVar106;
  auVar158._8_4_ = uVar106;
  auVar158._12_4_ = uVar106;
  auVar43 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar55 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar187._0_4_ = auVar55._0_4_ * fVar210;
  auVar187._4_4_ = auVar55._4_4_ * fVar101;
  auVar187._8_4_ = auVar55._8_4_ * fVar194;
  auVar187._12_4_ = auVar55._12_4_ * fVar205;
  auVar43 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar2,auVar43);
  auVar45 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar158);
  local_1b8 = vsubps_avx(_local_208,auVar5);
  uVar106 = local_1b8._0_4_;
  auVar159._4_4_ = uVar106;
  auVar159._0_4_ = uVar106;
  auVar159._8_4_ = uVar106;
  auVar159._12_4_ = uVar106;
  auVar43 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar55 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar196._0_4_ = auVar55._0_4_ * fVar210;
  auVar196._4_4_ = auVar55._4_4_ * fVar101;
  auVar196._8_4_ = auVar55._8_4_ * fVar194;
  auVar196._12_4_ = auVar55._12_4_ * fVar205;
  auVar43 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar2,auVar43);
  auVar47 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar159);
  local_1c8 = vsubps_avx512vl(_local_258,auVar5);
  uVar106 = local_1c8._0_4_;
  auVar160._4_4_ = uVar106;
  auVar160._0_4_ = uVar106;
  auVar160._8_4_ = uVar106;
  auVar160._12_4_ = uVar106;
  auVar43 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar55 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar212._0_4_ = auVar55._0_4_ * fVar210;
  auVar212._4_4_ = auVar55._4_4_ * fVar101;
  auVar212._8_4_ = auVar55._8_4_ * fVar194;
  auVar212._12_4_ = auVar55._12_4_ * fVar205;
  auVar43 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar2,auVar43);
  auVar48 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar160);
  local_1d8 = vsubps_avx512vl(_local_268,auVar5);
  uVar106 = local_1d8._0_4_;
  auVar161._4_4_ = uVar106;
  auVar161._0_4_ = uVar106;
  auVar161._8_4_ = uVar106;
  auVar161._12_4_ = uVar106;
  auVar43 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar55 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar223._0_4_ = auVar55._0_4_ * fVar210;
  auVar223._4_4_ = auVar55._4_4_ * fVar101;
  auVar223._8_4_ = auVar55._8_4_ * fVar194;
  auVar223._12_4_ = auVar55._12_4_ * fVar205;
  auVar43 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar2,auVar43);
  auVar49 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar161);
  local_1e8 = vsubps_avx512vl(_local_228,auVar5);
  uVar106 = local_1e8._0_4_;
  auVar50._4_4_ = uVar106;
  auVar50._0_4_ = uVar106;
  auVar50._8_4_ = uVar106;
  auVar50._12_4_ = uVar106;
  auVar43 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar55 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar150._0_4_ = auVar55._0_4_ * fVar210;
  auVar150._4_4_ = auVar55._4_4_ * fVar101;
  auVar150._8_4_ = auVar55._8_4_ * fVar194;
  auVar150._12_4_ = auVar55._12_4_ * fVar205;
  auVar43 = vfmadd231ps_fma(auVar150,(undefined1  [16])aVar2,auVar43);
  auVar5 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar50);
  auVar3 = vmovlhps_avx(auVar51,auVar47);
  auVar52 = vmovlhps_avx512f(auVar46,auVar48);
  auVar4 = vmovlhps_avx512f(auVar44,auVar49);
  _local_358 = vmovlhps_avx512f(auVar45,auVar5);
  auVar43 = vminps_avx512vl(auVar3,auVar52);
  auVar54 = vmaxps_avx512vl(auVar3,auVar52);
  auVar55 = vminps_avx512vl(auVar4,_local_358);
  auVar55 = vminps_avx(auVar43,auVar55);
  auVar43 = vmaxps_avx512vl(auVar4,_local_358);
  auVar43 = vmaxps_avx(auVar54,auVar43);
  auVar54 = vshufpd_avx(auVar55,auVar55,3);
  auVar53 = vshufpd_avx(auVar43,auVar43,3);
  auVar55 = vminps_avx(auVar55,auVar54);
  auVar43 = vmaxps_avx(auVar43,auVar53);
  auVar55 = vandps_avx512vl(auVar55,auVar247._0_16_);
  auVar43 = vandps_avx512vl(auVar43,auVar247._0_16_);
  auVar43 = vmaxps_avx(auVar55,auVar43);
  auVar55 = vmovshdup_avx(auVar43);
  auVar43 = vmaxss_avx(auVar55,auVar43);
  local_328._8_8_ = auVar51._0_8_;
  local_328._0_8_ = auVar51._0_8_;
  local_338 = vmovddup_avx512vl(auVar46);
  local_348 = vmovddup_avx512vl(auVar44);
  auVar107._8_8_ = auVar45._0_8_;
  auVar107._0_8_ = auVar45._0_8_;
  local_368 = ZEXT416((uint)(auVar43._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_368);
  auVar43 = vxorps_avx512vl(local_78._0_16_,auVar108);
  local_98 = vbroadcastss_avx512vl(auVar43);
  local_278 = vpbroadcastd_avx512vl();
  bVar41 = false;
  uVar33 = 0;
  fVar210 = *(float *)(ray + k * 4 + 0x30);
  auVar55 = vsubps_avx512vl(auVar52,auVar3);
  auVar54 = vsubps_avx512vl(auVar4,auVar52);
  auVar53 = vsubps_avx512vl(_local_358,auVar4);
  local_288 = vsubps_avx(_local_208,local_1f8);
  local_298 = vsubps_avx512vl(_local_258,local_238);
  local_2a8 = vsubps_avx512vl(_local_268,local_248);
  _local_2b8 = vsubps_avx512vl(_local_228,local_218);
  local_2c8 = vpbroadcastd_avx512vl();
  auVar43 = ZEXT816(0x3f80000000000000);
  auVar244 = ZEXT1664(auVar43);
  do {
    auVar56 = auVar244._0_16_;
    auVar51 = vshufps_avx(auVar56,auVar56,0x50);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar44 = vsubps_avx512vl(auVar74._0_16_,auVar51);
    fVar101 = auVar51._0_4_;
    fVar220 = auVar47._0_4_;
    auVar126._0_4_ = fVar220 * fVar101;
    fVar194 = auVar51._4_4_;
    fVar221 = auVar47._4_4_;
    auVar126._4_4_ = fVar221 * fVar194;
    fVar205 = auVar51._8_4_;
    auVar126._8_4_ = fVar220 * fVar205;
    fVar206 = auVar51._12_4_;
    auVar126._12_4_ = fVar221 * fVar206;
    fVar103 = auVar48._0_4_;
    auVar136._0_4_ = fVar103 * fVar101;
    fVar104 = auVar48._4_4_;
    auVar136._4_4_ = fVar104 * fVar194;
    auVar136._8_4_ = fVar103 * fVar205;
    auVar136._12_4_ = fVar104 * fVar206;
    fVar105 = auVar49._0_4_;
    auVar141._0_4_ = fVar105 * fVar101;
    fVar125 = auVar49._4_4_;
    auVar141._4_4_ = fVar125 * fVar194;
    auVar141._8_4_ = fVar105 * fVar205;
    auVar141._12_4_ = fVar125 * fVar206;
    fVar211 = auVar5._0_4_;
    auVar108._0_4_ = fVar211 * fVar101;
    fVar219 = auVar5._4_4_;
    auVar108._4_4_ = fVar219 * fVar194;
    auVar108._8_4_ = fVar211 * fVar205;
    auVar108._12_4_ = fVar219 * fVar206;
    auVar46 = vfmadd231ps_fma(auVar126,auVar44,local_328);
    auVar45 = vfmadd231ps_avx512vl(auVar136,auVar44,local_338);
    auVar50 = vfmadd231ps_avx512vl(auVar141,auVar44,local_348);
    auVar44 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar44);
    auVar51 = vmovshdup_avx(auVar43);
    fVar194 = auVar43._0_4_;
    fVar101 = (auVar51._0_4_ - fVar194) * 0.04761905;
    auVar171._4_4_ = fVar194;
    auVar171._0_4_ = fVar194;
    auVar171._8_4_ = fVar194;
    auVar171._12_4_ = fVar194;
    auVar171._16_4_ = fVar194;
    auVar171._20_4_ = fVar194;
    auVar171._24_4_ = fVar194;
    auVar171._28_4_ = fVar194;
    auVar122._0_8_ = auVar51._0_8_;
    auVar122._8_8_ = auVar122._0_8_;
    auVar122._16_8_ = auVar122._0_8_;
    auVar122._24_8_ = auVar122._0_8_;
    auVar73 = vsubps_avx(auVar122,auVar171);
    uVar106 = auVar46._0_4_;
    auVar123._4_4_ = uVar106;
    auVar123._0_4_ = uVar106;
    auVar123._8_4_ = uVar106;
    auVar123._12_4_ = uVar106;
    auVar123._16_4_ = uVar106;
    auVar123._20_4_ = uVar106;
    auVar123._24_4_ = uVar106;
    auVar123._28_4_ = uVar106;
    auVar191._8_4_ = 1;
    auVar191._0_8_ = 0x100000001;
    auVar191._12_4_ = 1;
    auVar191._16_4_ = 1;
    auVar191._20_4_ = 1;
    auVar191._24_4_ = 1;
    auVar191._28_4_ = 1;
    auVar72 = ZEXT1632(auVar46);
    auVar71 = vpermps_avx2(auVar191,auVar72);
    auVar75 = vbroadcastss_avx512vl(auVar45);
    auVar82 = ZEXT1632(auVar45);
    auVar76 = vpermps_avx512vl(auVar191,auVar82);
    auVar77 = vbroadcastss_avx512vl(auVar50);
    auVar84 = ZEXT1632(auVar50);
    auVar69 = vpermps_avx512vl(auVar191,auVar84);
    auVar70 = vbroadcastss_avx512vl(auVar44);
    auVar80 = ZEXT1632(auVar44);
    auVar78 = vpermps_avx512vl(auVar191,auVar80);
    auVar192._4_4_ = fVar101;
    auVar192._0_4_ = fVar101;
    auVar192._8_4_ = fVar101;
    auVar192._12_4_ = fVar101;
    auVar192._16_4_ = fVar101;
    auVar192._20_4_ = fVar101;
    auVar192._24_4_ = fVar101;
    auVar192._28_4_ = fVar101;
    auVar236._8_4_ = 2;
    auVar236._0_8_ = 0x200000002;
    auVar236._12_4_ = 2;
    auVar236._16_4_ = 2;
    auVar236._20_4_ = 2;
    auVar236._24_4_ = 2;
    auVar236._28_4_ = 2;
    auVar67 = vpermps_avx512vl(auVar236,auVar72);
    auVar154._8_4_ = 3;
    auVar154._0_8_ = 0x300000003;
    auVar154._12_4_ = 3;
    auVar154._16_4_ = 3;
    auVar154._20_4_ = 3;
    auVar154._24_4_ = 3;
    auVar154._28_4_ = 3;
    auVar68 = vpermps_avx512vl(auVar154,auVar72);
    auVar72 = vpermps_avx2(auVar236,auVar82);
    auVar82 = vpermps_avx2(auVar154,auVar82);
    auVar83 = vpermps_avx2(auVar236,auVar84);
    auVar84 = vpermps_avx2(auVar154,auVar84);
    auVar79 = vpermps_avx512vl(auVar236,auVar80);
    auVar80 = vpermps_avx512vl(auVar154,auVar80);
    auVar51 = vfmadd132ps_fma(auVar73,auVar171,_DAT_02020f20);
    auVar74 = vsubps_avx512vl(auVar74,ZEXT1632(auVar51));
    auVar73 = vmulps_avx512vl(auVar75,ZEXT1632(auVar51));
    auVar85 = ZEXT1632(auVar51);
    auVar81 = vmulps_avx512vl(auVar76,auVar85);
    auVar46 = vfmadd231ps_fma(auVar73,auVar74,auVar123);
    auVar44 = vfmadd231ps_fma(auVar81,auVar74,auVar71);
    auVar73 = vmulps_avx512vl(auVar77,auVar85);
    auVar81 = vmulps_avx512vl(auVar69,auVar85);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar74,auVar75);
    auVar75 = vfmadd231ps_avx512vl(auVar81,auVar74,auVar76);
    auVar76 = vmulps_avx512vl(auVar70,auVar85);
    auVar81 = ZEXT1632(auVar51);
    auVar78 = vmulps_avx512vl(auVar78,auVar81);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar74,auVar77);
    auVar77 = vfmadd231ps_avx512vl(auVar78,auVar74,auVar69);
    fVar205 = auVar51._0_4_;
    fVar206 = auVar51._4_4_;
    auVar22._4_4_ = fVar206 * auVar73._4_4_;
    auVar22._0_4_ = fVar205 * auVar73._0_4_;
    fVar207 = auVar51._8_4_;
    auVar22._8_4_ = fVar207 * auVar73._8_4_;
    fVar208 = auVar51._12_4_;
    auVar22._12_4_ = fVar208 * auVar73._12_4_;
    auVar22._16_4_ = auVar73._16_4_ * 0.0;
    auVar22._20_4_ = auVar73._20_4_ * 0.0;
    auVar22._24_4_ = auVar73._24_4_ * 0.0;
    auVar22._28_4_ = fVar194;
    auVar23._4_4_ = fVar206 * auVar75._4_4_;
    auVar23._0_4_ = fVar205 * auVar75._0_4_;
    auVar23._8_4_ = fVar207 * auVar75._8_4_;
    auVar23._12_4_ = fVar208 * auVar75._12_4_;
    auVar23._16_4_ = auVar75._16_4_ * 0.0;
    auVar23._20_4_ = auVar75._20_4_ * 0.0;
    auVar23._24_4_ = auVar75._24_4_ * 0.0;
    auVar23._28_4_ = auVar71._28_4_;
    auVar46 = vfmadd231ps_fma(auVar22,auVar74,ZEXT1632(auVar46));
    auVar44 = vfmadd231ps_fma(auVar23,auVar74,ZEXT1632(auVar44));
    auVar114._0_4_ = fVar205 * auVar76._0_4_;
    auVar114._4_4_ = fVar206 * auVar76._4_4_;
    auVar114._8_4_ = fVar207 * auVar76._8_4_;
    auVar114._12_4_ = fVar208 * auVar76._12_4_;
    auVar114._16_4_ = auVar76._16_4_ * 0.0;
    auVar114._20_4_ = auVar76._20_4_ * 0.0;
    auVar114._24_4_ = auVar76._24_4_ * 0.0;
    auVar114._28_4_ = 0;
    auVar24._4_4_ = fVar206 * auVar77._4_4_;
    auVar24._0_4_ = fVar205 * auVar77._0_4_;
    auVar24._8_4_ = fVar207 * auVar77._8_4_;
    auVar24._12_4_ = fVar208 * auVar77._12_4_;
    auVar24._16_4_ = auVar77._16_4_ * 0.0;
    auVar24._20_4_ = auVar77._20_4_ * 0.0;
    auVar24._24_4_ = auVar77._24_4_ * 0.0;
    auVar24._28_4_ = auVar76._28_4_;
    auVar45 = vfmadd231ps_fma(auVar114,auVar74,auVar73);
    auVar50 = vfmadd231ps_fma(auVar24,auVar74,auVar75);
    auVar25._28_4_ = auVar75._28_4_;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar208 * auVar50._12_4_,
                            CONCAT48(fVar207 * auVar50._8_4_,
                                     CONCAT44(fVar206 * auVar50._4_4_,fVar205 * auVar50._0_4_))));
    auVar58 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar208 * auVar45._12_4_,
                                                 CONCAT48(fVar207 * auVar45._8_4_,
                                                          CONCAT44(fVar206 * auVar45._4_4_,
                                                                   fVar205 * auVar45._0_4_)))),
                              auVar74,ZEXT1632(auVar46));
    auVar66 = vfmadd231ps_fma(auVar25,auVar74,ZEXT1632(auVar44));
    auVar73 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar46));
    auVar71 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar44));
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar73 = vmulps_avx512vl(auVar73,auVar75);
    auVar71 = vmulps_avx512vl(auVar71,auVar75);
    auVar183._0_4_ = fVar101 * auVar73._0_4_;
    auVar183._4_4_ = fVar101 * auVar73._4_4_;
    auVar183._8_4_ = fVar101 * auVar73._8_4_;
    auVar183._12_4_ = fVar101 * auVar73._12_4_;
    auVar183._16_4_ = fVar101 * auVar73._16_4_;
    auVar183._20_4_ = fVar101 * auVar73._20_4_;
    auVar183._24_4_ = fVar101 * auVar73._24_4_;
    auVar183._28_4_ = 0;
    auVar73 = vmulps_avx512vl(auVar192,auVar71);
    auVar45 = vxorps_avx512vl(auVar70._0_16_,auVar70._0_16_);
    auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar58),_DAT_0205fd20,ZEXT1632(auVar45));
    auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar66),_DAT_0205fd20,ZEXT1632(auVar45));
    auVar115._0_4_ = auVar183._0_4_ + auVar58._0_4_;
    auVar115._4_4_ = auVar183._4_4_ + auVar58._4_4_;
    auVar115._8_4_ = auVar183._8_4_ + auVar58._8_4_;
    auVar115._12_4_ = auVar183._12_4_ + auVar58._12_4_;
    auVar115._16_4_ = auVar183._16_4_ + 0.0;
    auVar115._20_4_ = auVar183._20_4_ + 0.0;
    auVar115._24_4_ = auVar183._24_4_ + 0.0;
    auVar115._28_4_ = 0;
    auVar85 = ZEXT1632(auVar45);
    auVar71 = vpermt2ps_avx512vl(auVar183,_DAT_0205fd20,auVar85);
    auVar69 = vaddps_avx512vl(ZEXT1632(auVar66),auVar73);
    auVar70 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,auVar85);
    auVar73 = vsubps_avx(auVar76,auVar71);
    auVar70 = vsubps_avx512vl(auVar77,auVar70);
    auVar71 = vmulps_avx512vl(auVar72,auVar81);
    auVar78 = vmulps_avx512vl(auVar82,auVar81);
    auVar71 = vfmadd231ps_avx512vl(auVar71,auVar74,auVar67);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar74,auVar68);
    auVar67 = vmulps_avx512vl(auVar83,auVar81);
    auVar68 = vmulps_avx512vl(auVar84,auVar81);
    auVar72 = vfmadd231ps_avx512vl(auVar67,auVar74,auVar72);
    auVar82 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar82);
    auVar67 = vmulps_avx512vl(auVar79,auVar81);
    auVar68 = vmulps_avx512vl(auVar80,auVar81);
    auVar46 = vfmadd231ps_fma(auVar67,auVar74,auVar83);
    auVar44 = vfmadd231ps_fma(auVar68,auVar74,auVar84);
    auVar67 = vmulps_avx512vl(auVar81,auVar72);
    auVar68 = vmulps_avx512vl(ZEXT1632(auVar51),auVar82);
    auVar71 = vfmadd231ps_avx512vl(auVar67,auVar74,auVar71);
    auVar78 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar78);
    auVar72 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar208 * auVar46._12_4_,
                                            CONCAT48(fVar207 * auVar46._8_4_,
                                                     CONCAT44(fVar206 * auVar46._4_4_,
                                                              fVar205 * auVar46._0_4_)))),auVar74,
                         auVar72);
    auVar82 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar208 * auVar44._12_4_,
                                            CONCAT48(fVar207 * auVar44._8_4_,
                                                     CONCAT44(fVar206 * auVar44._4_4_,
                                                              fVar205 * auVar44._0_4_)))),auVar74,
                         auVar82);
    auVar26._4_4_ = fVar206 * auVar72._4_4_;
    auVar26._0_4_ = fVar205 * auVar72._0_4_;
    auVar26._8_4_ = fVar207 * auVar72._8_4_;
    auVar26._12_4_ = fVar208 * auVar72._12_4_;
    auVar26._16_4_ = auVar72._16_4_ * 0.0;
    auVar26._20_4_ = auVar72._20_4_ * 0.0;
    auVar26._24_4_ = auVar72._24_4_ * 0.0;
    auVar26._28_4_ = auVar84._28_4_;
    auVar27._4_4_ = fVar206 * auVar82._4_4_;
    auVar27._0_4_ = fVar205 * auVar82._0_4_;
    auVar27._8_4_ = fVar207 * auVar82._8_4_;
    auVar27._12_4_ = fVar208 * auVar82._12_4_;
    auVar27._16_4_ = auVar82._16_4_ * 0.0;
    auVar27._20_4_ = auVar82._20_4_ * 0.0;
    auVar27._24_4_ = auVar82._24_4_ * 0.0;
    auVar27._28_4_ = auVar83._28_4_;
    auVar83 = vfmadd231ps_avx512vl(auVar26,auVar74,auVar71);
    auVar84 = vfmadd231ps_avx512vl(auVar27,auVar78,auVar74);
    auVar71 = vsubps_avx512vl(auVar72,auVar71);
    auVar72 = vsubps_avx512vl(auVar82,auVar78);
    auVar71 = vmulps_avx512vl(auVar71,auVar75);
    auVar72 = vmulps_avx512vl(auVar72,auVar75);
    fVar194 = fVar101 * auVar71._0_4_;
    fVar205 = fVar101 * auVar71._4_4_;
    auVar28._4_4_ = fVar205;
    auVar28._0_4_ = fVar194;
    fVar206 = fVar101 * auVar71._8_4_;
    auVar28._8_4_ = fVar206;
    fVar207 = fVar101 * auVar71._12_4_;
    auVar28._12_4_ = fVar207;
    fVar208 = fVar101 * auVar71._16_4_;
    auVar28._16_4_ = fVar208;
    fVar209 = fVar101 * auVar71._20_4_;
    auVar28._20_4_ = fVar209;
    fVar101 = fVar101 * auVar71._24_4_;
    auVar28._24_4_ = fVar101;
    auVar28._28_4_ = auVar71._28_4_;
    auVar72 = vmulps_avx512vl(auVar192,auVar72);
    auVar82 = vpermt2ps_avx512vl(auVar83,_DAT_0205fd20,auVar85);
    auVar74 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,auVar85);
    auVar193._0_4_ = auVar83._0_4_ + fVar194;
    auVar193._4_4_ = auVar83._4_4_ + fVar205;
    auVar193._8_4_ = auVar83._8_4_ + fVar206;
    auVar193._12_4_ = auVar83._12_4_ + fVar207;
    auVar193._16_4_ = auVar83._16_4_ + fVar208;
    auVar193._20_4_ = auVar83._20_4_ + fVar209;
    auVar193._24_4_ = auVar83._24_4_ + fVar101;
    auVar193._28_4_ = auVar83._28_4_ + auVar71._28_4_;
    auVar71 = vpermt2ps_avx512vl(auVar28,_DAT_0205fd20,ZEXT1632(auVar45));
    auVar75 = vaddps_avx512vl(auVar84,auVar72);
    auVar72 = vpermt2ps_avx512vl(auVar72,_DAT_0205fd20,ZEXT1632(auVar45));
    auVar71 = vsubps_avx(auVar82,auVar71);
    auVar72 = vsubps_avx512vl(auVar74,auVar72);
    auVar133 = ZEXT1632(auVar58);
    auVar78 = vsubps_avx512vl(auVar83,auVar133);
    auVar139 = ZEXT1632(auVar66);
    auVar67 = vsubps_avx512vl(auVar84,auVar139);
    auVar68 = vsubps_avx512vl(auVar82,auVar76);
    auVar78 = vaddps_avx512vl(auVar78,auVar68);
    auVar68 = vsubps_avx512vl(auVar74,auVar77);
    auVar67 = vaddps_avx512vl(auVar67,auVar68);
    auVar68 = vmulps_avx512vl(auVar139,auVar78);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar133,auVar67);
    auVar79 = vmulps_avx512vl(auVar69,auVar78);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar115,auVar67);
    auVar80 = vmulps_avx512vl(auVar70,auVar78);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar73,auVar67);
    auVar81 = vmulps_avx512vl(auVar77,auVar78);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar76,auVar67);
    auVar85 = vmulps_avx512vl(auVar84,auVar78);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar83,auVar67);
    auVar86 = vmulps_avx512vl(auVar75,auVar78);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar193,auVar67);
    auVar87 = vmulps_avx512vl(auVar72,auVar78);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar71,auVar67);
    auVar78 = vmulps_avx512vl(auVar74,auVar78);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar82,auVar67);
    auVar67 = vminps_avx512vl(auVar68,auVar79);
    auVar68 = vmaxps_avx512vl(auVar68,auVar79);
    auVar79 = vminps_avx512vl(auVar80,auVar81);
    auVar67 = vminps_avx512vl(auVar67,auVar79);
    auVar79 = vmaxps_avx512vl(auVar80,auVar81);
    auVar68 = vmaxps_avx512vl(auVar68,auVar79);
    auVar79 = vminps_avx512vl(auVar85,auVar86);
    auVar80 = vmaxps_avx512vl(auVar85,auVar86);
    auVar81 = vminps_avx512vl(auVar87,auVar78);
    auVar79 = vminps_avx512vl(auVar79,auVar81);
    auVar67 = vminps_avx512vl(auVar67,auVar79);
    auVar78 = vmaxps_avx512vl(auVar87,auVar78);
    auVar78 = vmaxps_avx512vl(auVar80,auVar78);
    auVar78 = vmaxps_avx512vl(auVar68,auVar78);
    uVar15 = vcmpps_avx512vl(auVar67,local_78,2);
    uVar17 = vcmpps_avx512vl(auVar78,local_98,5);
    uVar35 = 0;
    bVar31 = (byte)uVar15 & (byte)uVar17 & 0x7f;
    if (bVar31 != 0) {
      auVar78 = vsubps_avx512vl(auVar76,auVar133);
      auVar67 = vsubps_avx512vl(auVar77,auVar139);
      auVar68 = vsubps_avx512vl(auVar82,auVar83);
      auVar78 = vaddps_avx512vl(auVar78,auVar68);
      auVar68 = vsubps_avx512vl(auVar74,auVar84);
      auVar67 = vaddps_avx512vl(auVar67,auVar68);
      auVar68 = vmulps_avx512vl(auVar139,auVar78);
      auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar67,auVar133);
      auVar69 = vmulps_avx512vl(auVar69,auVar78);
      auVar69 = vfnmadd213ps_avx512vl(auVar115,auVar67,auVar69);
      auVar70 = vmulps_avx512vl(auVar70,auVar78);
      auVar70 = vfnmadd213ps_avx512vl(auVar73,auVar67,auVar70);
      auVar73 = vmulps_avx512vl(auVar77,auVar78);
      auVar76 = vfnmadd231ps_avx512vl(auVar73,auVar67,auVar76);
      auVar73 = vmulps_avx512vl(auVar84,auVar78);
      auVar83 = vfnmadd231ps_avx512vl(auVar73,auVar67,auVar83);
      auVar73 = vmulps_avx512vl(auVar75,auVar78);
      auVar84 = vfnmadd213ps_avx512vl(auVar193,auVar67,auVar73);
      auVar73 = vmulps_avx512vl(auVar72,auVar78);
      auVar75 = vfnmadd213ps_avx512vl(auVar71,auVar67,auVar73);
      auVar73 = vmulps_avx512vl(auVar74,auVar78);
      auVar74 = vfnmadd231ps_avx512vl(auVar73,auVar82,auVar67);
      auVar71 = vminps_avx(auVar68,auVar69);
      auVar73 = vmaxps_avx(auVar68,auVar69);
      auVar72 = vminps_avx(auVar70,auVar76);
      auVar72 = vminps_avx(auVar71,auVar72);
      auVar71 = vmaxps_avx(auVar70,auVar76);
      auVar73 = vmaxps_avx(auVar73,auVar71);
      auVar82 = vminps_avx(auVar83,auVar84);
      auVar71 = vmaxps_avx(auVar83,auVar84);
      auVar83 = vminps_avx(auVar75,auVar74);
      auVar82 = vminps_avx(auVar82,auVar83);
      auVar82 = vminps_avx(auVar72,auVar82);
      auVar72 = vmaxps_avx(auVar75,auVar74);
      auVar71 = vmaxps_avx(auVar71,auVar72);
      auVar73 = vmaxps_avx(auVar73,auVar71);
      uVar15 = vcmpps_avx512vl(auVar73,local_98,5);
      uVar17 = vcmpps_avx512vl(auVar82,local_78,2);
      uVar35 = (uint)(bVar31 & (byte)uVar15 & (byte)uVar17);
    }
    if (uVar35 != 0) {
      auStack_318[uVar33] = uVar35;
      uVar15 = vmovlps_avx(auVar43);
      *(undefined8 *)(&uStack_168 + uVar33 * 2) = uVar15;
      uVar38 = vmovlps_avx512f(auVar56);
      auStack_58[uVar33] = uVar38;
      uVar33 = (ulong)((int)uVar33 + 1);
    }
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar245 = ZEXT1664(auVar43);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar247 = ZEXT1664(auVar43);
    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar246 = ZEXT3264(auVar73);
    auVar248 = ZEXT464(0x3f800000);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar249 = ZEXT1664(auVar43);
    do {
      auVar43 = auVar249._0_16_;
      if ((int)uVar33 == 0) {
        if (bVar41) {
          return local_489;
        }
        uVar106 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar21._4_4_ = uVar106;
        auVar21._0_4_ = uVar106;
        auVar21._8_4_ = uVar106;
        auVar21._12_4_ = uVar106;
        auVar21._16_4_ = uVar106;
        auVar21._20_4_ = uVar106;
        auVar21._24_4_ = uVar106;
        auVar21._28_4_ = uVar106;
        uVar15 = vcmpps_avx512vl(local_b8,auVar21,2);
        uVar39 = (uint)uVar40 & (uint)uVar15;
        uVar40 = (ulong)uVar39;
        local_489 = uVar39 != 0;
        if (!local_489) {
          return local_489;
        }
        goto LAB_01dd2190;
      }
      uVar32 = (int)uVar33 - 1;
      uVar34 = (ulong)uVar32;
      uVar35 = (&uStack_168)[uVar34 * 2];
      fVar101 = afStack_164[uVar34 * 2];
      uVar7 = auStack_318[uVar34];
      auVar242._8_8_ = 0;
      auVar242._0_8_ = auStack_58[uVar34];
      auVar244 = ZEXT1664(auVar242);
      lVar36 = 0;
      for (uVar38 = (ulong)uVar7; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
        lVar36 = lVar36 + 1;
      }
      uVar37 = uVar7 - 1 & uVar7;
      auStack_318[uVar34] = uVar37;
      if (uVar37 == 0) {
        uVar33 = (ulong)uVar32;
      }
      auVar116._0_4_ = (float)lVar36;
      auVar116._4_8_ = SUB128(ZEXT812(0),4);
      auVar116._12_4_ = 0;
      auVar51 = vmulss_avx512f(auVar116,SUB6416(ZEXT464(0x3e124925),0));
      lVar36 = lVar36 + 1;
      auVar127._0_4_ = (float)lVar36;
      auVar127._4_8_ = SUB128(ZEXT812(0),4);
      auVar127._12_4_ = 0;
      auVar46 = vmulss_avx512f(auVar127,SUB6416(ZEXT464(0x3e124925),0));
      auVar45 = auVar248._0_16_;
      auVar44 = vsubss_avx512f(auVar45,auVar51);
      auVar51 = vmulss_avx512f(ZEXT416((uint)fVar101),auVar51);
      auVar44 = vfmadd231ss_avx512f(auVar51,ZEXT416(uVar35),auVar44);
      auVar51 = vsubss_avx512f(auVar45,auVar46);
      auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * auVar46._0_4_)),ZEXT416(uVar35),auVar51);
      auVar46 = vsubss_avx512f(auVar51,auVar44);
      vucomiss_avx512f(auVar46);
      if (uVar7 == 0 || lVar36 == 0) break;
      auVar50 = vshufps_avx(auVar242,auVar242,0x50);
      vucomiss_avx512f(auVar46);
      auVar56 = vsubps_avx512vl(auVar43,auVar50);
      fVar101 = auVar50._0_4_;
      auVar128._0_4_ = fVar220 * fVar101;
      fVar194 = auVar50._4_4_;
      auVar128._4_4_ = fVar221 * fVar194;
      fVar205 = auVar50._8_4_;
      auVar128._8_4_ = fVar220 * fVar205;
      fVar206 = auVar50._12_4_;
      auVar128._12_4_ = fVar221 * fVar206;
      auVar137._0_4_ = fVar103 * fVar101;
      auVar137._4_4_ = fVar104 * fVar194;
      auVar137._8_4_ = fVar103 * fVar205;
      auVar137._12_4_ = fVar104 * fVar206;
      auVar142._0_4_ = fVar105 * fVar101;
      auVar142._4_4_ = fVar125 * fVar194;
      auVar142._8_4_ = fVar105 * fVar205;
      auVar142._12_4_ = fVar125 * fVar206;
      auVar109._0_4_ = fVar211 * fVar101;
      auVar109._4_4_ = fVar219 * fVar194;
      auVar109._8_4_ = fVar211 * fVar205;
      auVar109._12_4_ = fVar219 * fVar206;
      auVar50 = vfmadd231ps_fma(auVar128,auVar56,local_328);
      auVar58 = vfmadd231ps_fma(auVar137,auVar56,local_338);
      auVar66 = vfmadd231ps_fma(auVar142,auVar56,local_348);
      auVar57 = vfmadd231ps_avx512vl(auVar109,auVar107,auVar56);
      auVar124._16_16_ = auVar50;
      auVar124._0_16_ = auVar50;
      auVar134._16_16_ = auVar58;
      auVar134._0_16_ = auVar58;
      auVar140._16_16_ = auVar66;
      auVar140._0_16_ = auVar66;
      auVar155._0_4_ = auVar44._0_4_;
      auVar155._4_4_ = auVar155._0_4_;
      auVar155._8_4_ = auVar155._0_4_;
      auVar155._12_4_ = auVar155._0_4_;
      uVar106 = auVar51._0_4_;
      auVar155._20_4_ = uVar106;
      auVar155._16_4_ = uVar106;
      auVar155._24_4_ = uVar106;
      auVar155._28_4_ = uVar106;
      auVar73 = vsubps_avx(auVar134,auVar124);
      auVar58 = vfmadd213ps_fma(auVar73,auVar155,auVar124);
      auVar73 = vsubps_avx(auVar140,auVar134);
      auVar56 = vfmadd213ps_fma(auVar73,auVar155,auVar134);
      auVar50 = vsubps_avx(auVar57,auVar66);
      auVar135._16_16_ = auVar50;
      auVar135._0_16_ = auVar50;
      auVar50 = vfmadd213ps_fma(auVar135,auVar155,auVar140);
      auVar73 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar58));
      auVar58 = vfmadd213ps_fma(auVar73,auVar155,ZEXT1632(auVar58));
      auVar73 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar56));
      auVar50 = vfmadd213ps_fma(auVar73,auVar155,ZEXT1632(auVar56));
      auVar73 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar58));
      auVar149 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar73,auVar155);
      auVar73 = vmulps_avx512vl(auVar73,auVar246._0_32_);
      auVar89._16_16_ = auVar73._16_16_;
      auVar50 = vmulss_avx512f(auVar46,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar101 = auVar50._0_4_;
      auVar143._0_8_ =
           CONCAT44(auVar149._4_4_ + fVar101 * auVar73._4_4_,
                    auVar149._0_4_ + fVar101 * auVar73._0_4_);
      auVar143._8_4_ = auVar149._8_4_ + fVar101 * auVar73._8_4_;
      auVar143._12_4_ = auVar149._12_4_ + fVar101 * auVar73._12_4_;
      auVar129._0_4_ = fVar101 * auVar73._16_4_;
      auVar129._4_4_ = fVar101 * auVar73._20_4_;
      auVar129._8_4_ = fVar101 * auVar73._24_4_;
      auVar129._12_4_ = fVar101 * auVar73._28_4_;
      auVar147 = vsubps_avx((undefined1  [16])0x0,auVar129);
      auVar64 = vshufpd_avx(auVar149,auVar149,3);
      auVar62 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar50 = vsubps_avx(auVar64,auVar149);
      auVar58 = vsubps_avx(auVar62,(undefined1  [16])0x0);
      auVar162._0_4_ = auVar58._0_4_ + auVar50._0_4_;
      auVar162._4_4_ = auVar58._4_4_ + auVar50._4_4_;
      auVar162._8_4_ = auVar58._8_4_ + auVar50._8_4_;
      auVar162._12_4_ = auVar58._12_4_ + auVar50._12_4_;
      auVar50 = vshufps_avx(auVar149,auVar149,0xb1);
      auVar58 = vshufps_avx(auVar143,auVar143,0xb1);
      auVar66 = vshufps_avx(auVar147,auVar147,0xb1);
      auVar56 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar224._4_4_ = auVar162._0_4_;
      auVar224._0_4_ = auVar162._0_4_;
      auVar224._8_4_ = auVar162._0_4_;
      auVar224._12_4_ = auVar162._0_4_;
      auVar57 = vshufps_avx(auVar162,auVar162,0x55);
      fVar101 = auVar57._0_4_;
      auVar174._0_4_ = auVar50._0_4_ * fVar101;
      fVar194 = auVar57._4_4_;
      auVar174._4_4_ = auVar50._4_4_ * fVar194;
      fVar205 = auVar57._8_4_;
      auVar174._8_4_ = auVar50._8_4_ * fVar205;
      fVar206 = auVar57._12_4_;
      auVar174._12_4_ = auVar50._12_4_ * fVar206;
      auVar188._0_4_ = auVar58._0_4_ * fVar101;
      auVar188._4_4_ = auVar58._4_4_ * fVar194;
      auVar188._8_4_ = auVar58._8_4_ * fVar205;
      auVar188._12_4_ = auVar58._12_4_ * fVar206;
      auVar197._0_4_ = auVar66._0_4_ * fVar101;
      auVar197._4_4_ = auVar66._4_4_ * fVar194;
      auVar197._8_4_ = auVar66._8_4_ * fVar205;
      auVar197._12_4_ = auVar66._12_4_ * fVar206;
      auVar163._0_4_ = auVar56._0_4_ * fVar101;
      auVar163._4_4_ = auVar56._4_4_ * fVar194;
      auVar163._8_4_ = auVar56._8_4_ * fVar205;
      auVar163._12_4_ = auVar56._12_4_ * fVar206;
      auVar50 = vfmadd231ps_fma(auVar174,auVar224,auVar149);
      auVar58 = vfmadd231ps_fma(auVar188,auVar224,auVar143);
      auVar57 = vfmadd231ps_fma(auVar197,auVar224,auVar147);
      auVar148 = vfmadd231ps_fma(auVar163,(undefined1  [16])0x0,auVar224);
      auVar63 = vshufpd_avx(auVar50,auVar50,1);
      auVar59 = vshufpd_avx(auVar58,auVar58,1);
      auVar60 = vshufpd_avx(auVar57,auVar57,1);
      auVar61 = vshufpd_avx(auVar148,auVar148,1);
      auVar66 = vminss_avx(auVar50,auVar58);
      auVar50 = vmaxss_avx(auVar58,auVar50);
      auVar56 = vminss_avx(auVar57,auVar148);
      auVar58 = vmaxss_avx(auVar148,auVar57);
      auVar56 = vminss_avx(auVar66,auVar56);
      auVar50 = vmaxss_avx(auVar58,auVar50);
      auVar57 = vminss_avx(auVar63,auVar59);
      auVar58 = vmaxss_avx(auVar59,auVar63);
      auVar63 = vminss_avx(auVar60,auVar61);
      auVar66 = vmaxss_avx(auVar61,auVar60);
      auVar57 = vminss_avx(auVar57,auVar63);
      auVar58 = vmaxss_avx(auVar66,auVar58);
      fVar205 = auVar56._0_4_;
      fVar194 = auVar58._0_4_;
      fVar101 = auVar50._0_4_;
      if ((0.0001 <= fVar205) || (fVar194 <= -0.0001)) {
        uVar15 = vcmpps_avx512vl(auVar57,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar17 = vcmpps_avx512vl(auVar56,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar101 & ((byte)uVar17 | (byte)uVar15)) != 0) goto LAB_01dd30d8;
        uVar15 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar58,5);
        uVar17 = vcmpps_avx512vl(auVar57,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar17 | (ushort)uVar15) & 1) == 0) goto LAB_01dd30d8;
        bVar16 = true;
        auVar244 = ZEXT1664(auVar242);
      }
      else {
LAB_01dd30d8:
        auVar59 = auVar252._0_16_;
        uVar15 = vcmpss_avx512f(auVar56,auVar59,1);
        bVar16 = (bool)((byte)uVar15 & 1);
        iVar100 = auVar248._0_4_;
        fVar206 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar100);
        uVar15 = vcmpss_avx512f(auVar50,auVar59,1);
        bVar16 = (bool)((byte)uVar15 & 1);
        fVar207 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar100);
        bVar16 = fVar206 != fVar207;
        iVar251 = auVar252._0_4_;
        auVar89._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar88._4_28_ = auVar89._4_28_;
        auVar88._0_4_ = (uint)bVar16 * iVar251 + (uint)!bVar16 * 0x7f800000;
        auVar63 = auVar88._0_16_;
        auVar91._16_16_ = auVar89._16_16_;
        auVar91._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar90._4_28_ = auVar91._4_28_;
        auVar90._0_4_ = (uint)bVar16 * iVar251 + (uint)!bVar16 * -0x800000;
        auVar66 = auVar90._0_16_;
        uVar15 = vcmpss_avx512f(auVar57,auVar59,1);
        bVar16 = (bool)((byte)uVar15 & 1);
        fVar208 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar100);
        if ((fVar206 != fVar208) || (NAN(fVar206) || NAN(fVar208))) {
          fVar206 = auVar57._0_4_;
          bVar16 = fVar206 == fVar205;
          if ((!bVar16) || (NAN(fVar206) || NAN(fVar205))) {
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar56 = vxorps_avx512vl(auVar56,auVar20);
            auVar238._0_4_ = auVar56._0_4_ / (fVar206 - fVar205);
            auVar238._4_12_ = auVar56._4_12_;
            auVar56 = vsubss_avx512f(auVar45,auVar238);
            auVar57 = vfmadd213ss_avx512f(auVar56,auVar59,auVar238);
            auVar56 = auVar57;
          }
          else {
            vucomiss_avx512f(auVar59);
            auVar93._16_16_ = auVar89._16_16_;
            auVar93._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar92._4_28_ = auVar93._4_28_;
            auVar92._0_4_ = (uint)bVar16 * iVar251 + (uint)!bVar16 * 0x7f800000;
            auVar57 = auVar92._0_16_;
            auVar56 = ZEXT416((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * -0x800000);
          }
          auVar63 = vminss_avx(auVar63,auVar57);
          auVar66 = vmaxss_avx(auVar56,auVar66);
        }
        auVar244 = ZEXT1664(auVar242);
        uVar15 = vcmpss_avx512f(auVar58,auVar59,1);
        bVar16 = (bool)((byte)uVar15 & 1);
        fVar205 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar100);
        if ((fVar207 != fVar205) || (NAN(fVar207) || NAN(fVar205))) {
          bVar16 = fVar194 == fVar101;
          if ((!bVar16) || (NAN(fVar194) || NAN(fVar101))) {
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar50 = vxorps_avx512vl(auVar50,auVar19);
            auVar198._0_4_ = auVar50._0_4_ / (fVar194 - fVar101);
            auVar198._4_12_ = auVar50._4_12_;
            auVar50 = vsubss_avx512f(auVar45,auVar198);
            auVar58 = vfmadd213ss_avx512f(auVar50,auVar59,auVar198);
            auVar50 = auVar58;
          }
          else {
            vucomiss_avx512f(auVar59);
            auVar95._16_16_ = auVar89._16_16_;
            auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar94._4_28_ = auVar95._4_28_;
            auVar94._0_4_ = (uint)bVar16 * iVar251 + (uint)!bVar16 * 0x7f800000;
            auVar58 = auVar94._0_16_;
            auVar50 = ZEXT416((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * -0x800000);
          }
          auVar63 = vminss_avx(auVar63,auVar58);
          auVar66 = vmaxss_avx(auVar50,auVar66);
        }
        bVar16 = fVar208 != fVar205;
        auVar50 = vminss_avx512f(auVar63,auVar45);
        auVar97._16_16_ = auVar89._16_16_;
        auVar97._0_16_ = auVar63;
        auVar96._4_28_ = auVar97._4_28_;
        auVar96._0_4_ = (uint)bVar16 * auVar50._0_4_ + (uint)!bVar16 * auVar63._0_4_;
        auVar50 = vmaxss_avx512f(auVar45,auVar66);
        auVar99._16_16_ = auVar89._16_16_;
        auVar99._0_16_ = auVar66;
        auVar98._4_28_ = auVar99._4_28_;
        auVar98._0_4_ = (uint)bVar16 * auVar50._0_4_ + (uint)!bVar16 * auVar66._0_4_;
        auVar50 = vmaxss_avx512f(auVar59,auVar96._0_16_);
        auVar58 = vminss_avx512f(auVar98._0_16_,auVar45);
        bVar16 = true;
        if (auVar50._0_4_ <= auVar58._0_4_) {
          auVar59 = vmaxss_avx512f(auVar59,ZEXT416((uint)(auVar50._0_4_ + -0.1)));
          auVar60 = vminss_avx512f(ZEXT416((uint)(auVar58._0_4_ + 0.1)),auVar45);
          auVar110._0_8_ = auVar149._0_8_;
          auVar110._8_8_ = auVar110._0_8_;
          auVar189._8_8_ = auVar143._0_8_;
          auVar189._0_8_ = auVar143._0_8_;
          auVar199._8_8_ = auVar147._0_8_;
          auVar199._0_8_ = auVar147._0_8_;
          auVar50 = vshufpd_avx(auVar143,auVar143,3);
          auVar58 = vshufpd_avx(auVar147,auVar147,3);
          auVar66 = vshufps_avx(auVar59,auVar60,0);
          auVar61 = vsubps_avx512vl(auVar43,auVar66);
          fVar101 = auVar66._0_4_;
          auVar234._0_4_ = fVar101 * auVar64._0_4_;
          fVar194 = auVar66._4_4_;
          auVar234._4_4_ = fVar194 * auVar64._4_4_;
          fVar205 = auVar66._8_4_;
          auVar234._8_4_ = fVar205 * auVar64._8_4_;
          fVar206 = auVar66._12_4_;
          auVar234._12_4_ = fVar206 * auVar64._12_4_;
          auVar144._0_4_ = fVar101 * auVar50._0_4_;
          auVar144._4_4_ = fVar194 * auVar50._4_4_;
          auVar144._8_4_ = fVar205 * auVar50._8_4_;
          auVar144._12_4_ = fVar206 * auVar50._12_4_;
          auVar151._0_4_ = fVar101 * auVar58._0_4_;
          auVar151._4_4_ = fVar194 * auVar58._4_4_;
          auVar151._8_4_ = fVar205 * auVar58._8_4_;
          auVar151._12_4_ = fVar206 * auVar58._12_4_;
          auVar130._0_4_ = fVar101 * auVar62._0_4_;
          auVar130._4_4_ = fVar194 * auVar62._4_4_;
          auVar130._8_4_ = fVar205 * auVar62._8_4_;
          auVar130._12_4_ = fVar206 * auVar62._12_4_;
          auVar56 = vfmadd231ps_fma(auVar234,auVar61,auVar110);
          auVar57 = vfmadd231ps_fma(auVar144,auVar61,auVar189);
          auVar63 = vfmadd231ps_fma(auVar151,auVar61,auVar199);
          auVar64 = vfmadd231ps_fma(auVar130,auVar61,ZEXT816(0));
          auVar58 = vsubss_avx512f(auVar45,auVar59);
          auVar50 = vmovshdup_avx(auVar242);
          auVar148 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar59._0_4_)),auVar242,auVar58
                                    );
          auVar58 = vsubss_avx512f(auVar45,auVar60);
          auVar149 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * auVar50._0_4_)),auVar242,auVar58
                                    );
          auVar62 = vdivss_avx512f(auVar45,auVar46);
          auVar46 = vsubps_avx(auVar57,auVar56);
          auVar117._0_4_ = auVar46._0_4_ * 3.0;
          auVar117._4_4_ = auVar46._4_4_ * 3.0;
          auVar117._8_4_ = auVar46._8_4_ * 3.0;
          auVar117._12_4_ = auVar46._12_4_ * 3.0;
          auVar46 = vsubps_avx(auVar63,auVar57);
          auVar164._0_4_ = auVar46._0_4_ * 3.0;
          auVar164._4_4_ = auVar46._4_4_ * 3.0;
          auVar164._8_4_ = auVar46._8_4_ * 3.0;
          auVar164._12_4_ = auVar46._12_4_ * 3.0;
          auVar46 = vsubps_avx(auVar64,auVar63);
          auVar175._0_4_ = auVar46._0_4_ * 3.0;
          auVar175._4_4_ = auVar46._4_4_ * 3.0;
          auVar175._8_4_ = auVar46._8_4_ * 3.0;
          auVar175._12_4_ = auVar46._12_4_ * 3.0;
          auVar50 = vminps_avx(auVar164,auVar175);
          auVar46 = vmaxps_avx(auVar164,auVar175);
          auVar50 = vminps_avx(auVar117,auVar50);
          auVar46 = vmaxps_avx(auVar117,auVar46);
          auVar58 = vshufpd_avx(auVar50,auVar50,3);
          auVar66 = vshufpd_avx(auVar46,auVar46,3);
          auVar50 = vminps_avx(auVar50,auVar58);
          auVar46 = vmaxps_avx(auVar46,auVar66);
          fVar101 = auVar62._0_4_;
          auVar176._0_4_ = fVar101 * auVar50._0_4_;
          auVar176._4_4_ = fVar101 * auVar50._4_4_;
          auVar176._8_4_ = fVar101 * auVar50._8_4_;
          auVar176._12_4_ = fVar101 * auVar50._12_4_;
          auVar165._0_4_ = fVar101 * auVar46._0_4_;
          auVar165._4_4_ = fVar101 * auVar46._4_4_;
          auVar165._8_4_ = fVar101 * auVar46._8_4_;
          auVar165._12_4_ = fVar101 * auVar46._12_4_;
          auVar62 = vdivss_avx512f(auVar45,ZEXT416((uint)(auVar149._0_4_ - auVar148._0_4_)));
          auVar46 = vshufpd_avx(auVar56,auVar56,3);
          auVar50 = vshufpd_avx(auVar57,auVar57,3);
          auVar58 = vshufpd_avx(auVar63,auVar63,3);
          auVar66 = vshufpd_avx(auVar64,auVar64,3);
          auVar46 = vsubps_avx(auVar46,auVar56);
          auVar56 = vsubps_avx(auVar50,auVar57);
          auVar57 = vsubps_avx(auVar58,auVar63);
          auVar66 = vsubps_avx(auVar66,auVar64);
          auVar50 = vminps_avx(auVar46,auVar56);
          auVar46 = vmaxps_avx(auVar46,auVar56);
          auVar58 = vminps_avx(auVar57,auVar66);
          auVar58 = vminps_avx(auVar50,auVar58);
          auVar50 = vmaxps_avx(auVar57,auVar66);
          auVar46 = vmaxps_avx(auVar46,auVar50);
          fVar101 = auVar62._0_4_;
          auVar200._0_4_ = fVar101 * auVar58._0_4_;
          auVar200._4_4_ = fVar101 * auVar58._4_4_;
          auVar200._8_4_ = fVar101 * auVar58._8_4_;
          auVar200._12_4_ = fVar101 * auVar58._12_4_;
          auVar213._0_4_ = fVar101 * auVar46._0_4_;
          auVar213._4_4_ = fVar101 * auVar46._4_4_;
          auVar213._8_4_ = fVar101 * auVar46._8_4_;
          auVar213._12_4_ = fVar101 * auVar46._12_4_;
          auVar147 = vinsertps_avx512f(auVar44,auVar148,0x10);
          auVar56 = vinsertps_avx(auVar51,auVar149,0x10);
          auVar102._0_4_ = auVar147._0_4_ + auVar56._0_4_;
          auVar102._4_4_ = auVar147._4_4_ + auVar56._4_4_;
          auVar102._8_4_ = auVar147._8_4_ + auVar56._8_4_;
          auVar102._12_4_ = auVar147._12_4_ + auVar56._12_4_;
          auVar60 = vmulps_avx512vl(auVar102,auVar245._0_16_);
          auVar58 = vshufps_avx(auVar60,auVar60,0x54);
          uVar106 = auVar60._0_4_;
          auVar118._4_4_ = uVar106;
          auVar118._0_4_ = uVar106;
          auVar118._8_4_ = uVar106;
          auVar118._12_4_ = uVar106;
          auVar57 = vfmadd213ps_avx512vl(auVar55,auVar118,auVar3);
          auVar50 = vfmadd213ps_fma(auVar54,auVar118,auVar52);
          auVar66 = vfmadd213ps_fma(auVar53,auVar118,auVar4);
          auVar46 = vsubps_avx(auVar50,auVar57);
          auVar57 = vfmadd213ps_fma(auVar46,auVar118,auVar57);
          auVar46 = vsubps_avx(auVar66,auVar50);
          auVar46 = vfmadd213ps_fma(auVar46,auVar118,auVar50);
          auVar46 = vsubps_avx(auVar46,auVar57);
          auVar50 = vfmadd231ps_fma(auVar57,auVar46,auVar118);
          auVar119._0_8_ = CONCAT44(auVar46._4_4_ * 3.0,auVar46._0_4_ * 3.0);
          auVar119._8_4_ = auVar46._8_4_ * 3.0;
          auVar119._12_4_ = auVar46._12_4_ * 3.0;
          auVar225._8_8_ = auVar50._0_8_;
          auVar225._0_8_ = auVar50._0_8_;
          auVar46 = vshufpd_avx(auVar50,auVar50,3);
          auVar50 = vshufps_avx(auVar60,auVar60,0x55);
          auVar66 = vsubps_avx(auVar46,auVar225);
          auVar57 = vfmadd231ps_fma(auVar225,auVar50,auVar66);
          auVar239._8_8_ = auVar119._0_8_;
          auVar239._0_8_ = auVar119._0_8_;
          auVar46 = vshufpd_avx(auVar119,auVar119,3);
          auVar46 = vsubps_avx(auVar46,auVar239);
          auVar50 = vfmadd213ps_fma(auVar46,auVar50,auVar239);
          auVar63 = vxorps_avx512vl(auVar66,auVar250._0_16_);
          auVar46 = vmovshdup_avx(auVar50);
          auVar64 = vxorps_avx512vl(auVar46,auVar250._0_16_);
          auVar62 = vmovshdup_avx512vl(auVar66);
          auVar64 = vpermt2ps_avx512vl(auVar64,ZEXT416(5),auVar66);
          auVar46 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar46._0_4_ * auVar66._0_4_)),auVar50,
                                        auVar62);
          auVar50 = vpermt2ps_avx512vl(auVar50,SUB6416(ZEXT464(4),0),auVar63);
          auVar131._0_4_ = auVar46._0_4_;
          auVar131._4_4_ = auVar131._0_4_;
          auVar131._8_4_ = auVar131._0_4_;
          auVar131._12_4_ = auVar131._0_4_;
          auVar46 = vdivps_avx(auVar64,auVar131);
          auVar50 = vdivps_avx(auVar50,auVar131);
          fVar194 = auVar57._0_4_;
          auVar66 = vshufps_avx(auVar57,auVar57,0x55);
          fVar101 = auVar50._0_4_;
          auVar226._0_4_ = fVar194 * auVar46._0_4_ + auVar66._0_4_ * fVar101;
          auVar226._4_4_ = fVar194 * auVar46._4_4_ + auVar66._4_4_ * auVar50._4_4_;
          auVar226._8_4_ = fVar194 * auVar46._8_4_ + auVar66._8_4_ * auVar50._8_4_;
          auVar226._12_4_ = fVar194 * auVar46._12_4_ + auVar66._12_4_ * auVar50._12_4_;
          auVar61 = vsubps_avx(auVar58,auVar226);
          auVar57 = vmovshdup_avx(auVar46);
          auVar58 = vinsertps_avx(auVar176,auVar200,0x1c);
          auVar240._0_4_ = auVar57._0_4_ * auVar58._0_4_;
          auVar240._4_4_ = auVar57._4_4_ * auVar58._4_4_;
          auVar240._8_4_ = auVar57._8_4_ * auVar58._8_4_;
          auVar240._12_4_ = auVar57._12_4_ * auVar58._12_4_;
          auVar66 = vinsertps_avx(auVar165,auVar213,0x1c);
          auVar227._0_4_ = auVar57._0_4_ * auVar66._0_4_;
          auVar227._4_4_ = auVar57._4_4_ * auVar66._4_4_;
          auVar227._8_4_ = auVar57._8_4_ * auVar66._8_4_;
          auVar227._12_4_ = auVar57._12_4_ * auVar66._12_4_;
          auVar59 = vminps_avx512vl(auVar240,auVar227);
          auVar64 = vmaxps_avx(auVar227,auVar240);
          auVar62 = vmovshdup_avx(auVar50);
          auVar57 = vinsertps_avx(auVar200,auVar176,0x4c);
          auVar201._0_4_ = auVar62._0_4_ * auVar57._0_4_;
          auVar201._4_4_ = auVar62._4_4_ * auVar57._4_4_;
          auVar201._8_4_ = auVar62._8_4_ * auVar57._8_4_;
          auVar201._12_4_ = auVar62._12_4_ * auVar57._12_4_;
          auVar63 = vinsertps_avx(auVar213,auVar165,0x4c);
          auVar214._0_4_ = auVar62._0_4_ * auVar63._0_4_;
          auVar214._4_4_ = auVar62._4_4_ * auVar63._4_4_;
          auVar214._8_4_ = auVar62._8_4_ * auVar63._8_4_;
          auVar214._12_4_ = auVar62._12_4_ * auVar63._12_4_;
          auVar62 = vminps_avx(auVar201,auVar214);
          auVar59 = vaddps_avx512vl(auVar59,auVar62);
          auVar62 = vmaxps_avx(auVar214,auVar201);
          auVar202._0_4_ = auVar64._0_4_ + auVar62._0_4_;
          auVar202._4_4_ = auVar64._4_4_ + auVar62._4_4_;
          auVar202._8_4_ = auVar64._8_4_ + auVar62._8_4_;
          auVar202._12_4_ = auVar64._12_4_ + auVar62._12_4_;
          auVar215._8_8_ = 0x3f80000000000000;
          auVar215._0_8_ = 0x3f80000000000000;
          auVar64 = vsubps_avx(auVar215,auVar202);
          auVar62 = vsubps_avx(auVar215,auVar59);
          auVar59 = vsubps_avx(auVar147,auVar60);
          auVar60 = vsubps_avx(auVar56,auVar60);
          fVar208 = auVar59._0_4_;
          auVar241._0_4_ = fVar208 * auVar64._0_4_;
          fVar209 = auVar59._4_4_;
          auVar241._4_4_ = fVar209 * auVar64._4_4_;
          fVar222 = auVar59._8_4_;
          auVar241._8_4_ = fVar222 * auVar64._8_4_;
          fVar230 = auVar59._12_4_;
          auVar241._12_4_ = fVar230 * auVar64._12_4_;
          auVar65 = vbroadcastss_avx512vl(auVar46);
          auVar58 = vmulps_avx512vl(auVar65,auVar58);
          auVar66 = vmulps_avx512vl(auVar65,auVar66);
          auVar65 = vminps_avx512vl(auVar58,auVar66);
          auVar58 = vmaxps_avx(auVar66,auVar58);
          auVar177._0_4_ = fVar101 * auVar57._0_4_;
          auVar177._4_4_ = fVar101 * auVar57._4_4_;
          auVar177._8_4_ = fVar101 * auVar57._8_4_;
          auVar177._12_4_ = fVar101 * auVar57._12_4_;
          auVar166._0_4_ = fVar101 * auVar63._0_4_;
          auVar166._4_4_ = fVar101 * auVar63._4_4_;
          auVar166._8_4_ = fVar101 * auVar63._8_4_;
          auVar166._12_4_ = fVar101 * auVar63._12_4_;
          auVar66 = vminps_avx(auVar177,auVar166);
          auVar57 = vaddps_avx512vl(auVar65,auVar66);
          auVar63 = vmulps_avx512vl(auVar59,auVar62);
          fVar194 = auVar60._0_4_;
          auVar203._0_4_ = fVar194 * auVar64._0_4_;
          fVar205 = auVar60._4_4_;
          auVar203._4_4_ = fVar205 * auVar64._4_4_;
          fVar206 = auVar60._8_4_;
          auVar203._8_4_ = fVar206 * auVar64._8_4_;
          fVar207 = auVar60._12_4_;
          auVar203._12_4_ = fVar207 * auVar64._12_4_;
          auVar216._0_4_ = fVar194 * auVar62._0_4_;
          auVar216._4_4_ = fVar205 * auVar62._4_4_;
          auVar216._8_4_ = fVar206 * auVar62._8_4_;
          auVar216._12_4_ = fVar207 * auVar62._12_4_;
          auVar66 = vmaxps_avx(auVar166,auVar177);
          auVar167._0_4_ = auVar58._0_4_ + auVar66._0_4_;
          auVar167._4_4_ = auVar58._4_4_ + auVar66._4_4_;
          auVar167._8_4_ = auVar58._8_4_ + auVar66._8_4_;
          auVar167._12_4_ = auVar58._12_4_ + auVar66._12_4_;
          auVar178._8_8_ = 0x3f800000;
          auVar178._0_8_ = 0x3f800000;
          auVar58 = vsubps_avx(auVar178,auVar167);
          auVar66 = vsubps_avx(auVar178,auVar57);
          auVar235._0_4_ = fVar208 * auVar58._0_4_;
          auVar235._4_4_ = fVar209 * auVar58._4_4_;
          auVar235._8_4_ = fVar222 * auVar58._8_4_;
          auVar235._12_4_ = fVar230 * auVar58._12_4_;
          auVar228._0_4_ = fVar208 * auVar66._0_4_;
          auVar228._4_4_ = fVar209 * auVar66._4_4_;
          auVar228._8_4_ = fVar222 * auVar66._8_4_;
          auVar228._12_4_ = fVar230 * auVar66._12_4_;
          auVar168._0_4_ = fVar194 * auVar58._0_4_;
          auVar168._4_4_ = fVar205 * auVar58._4_4_;
          auVar168._8_4_ = fVar206 * auVar58._8_4_;
          auVar168._12_4_ = fVar207 * auVar58._12_4_;
          auVar179._0_4_ = fVar194 * auVar66._0_4_;
          auVar179._4_4_ = fVar205 * auVar66._4_4_;
          auVar179._8_4_ = fVar206 * auVar66._8_4_;
          auVar179._12_4_ = fVar207 * auVar66._12_4_;
          auVar58 = vminps_avx(auVar235,auVar228);
          auVar66 = vminps_avx(auVar168,auVar179);
          auVar57 = vminps_avx(auVar58,auVar66);
          auVar58 = vmaxps_avx(auVar228,auVar235);
          auVar66 = vmaxps_avx(auVar179,auVar168);
          auVar66 = vmaxps_avx(auVar66,auVar58);
          auVar64 = vminps_avx512vl(auVar241,auVar63);
          auVar58 = vminps_avx(auVar203,auVar216);
          auVar58 = vminps_avx(auVar64,auVar58);
          auVar58 = vhaddps_avx(auVar57,auVar58);
          auVar63 = vmaxps_avx512vl(auVar63,auVar241);
          auVar57 = vmaxps_avx(auVar216,auVar203);
          auVar57 = vmaxps_avx(auVar57,auVar63);
          auVar66 = vhaddps_avx(auVar66,auVar57);
          auVar58 = vshufps_avx(auVar58,auVar58,0xe8);
          auVar66 = vshufps_avx(auVar66,auVar66,0xe8);
          auVar169._0_4_ = auVar58._0_4_ + auVar61._0_4_;
          auVar169._4_4_ = auVar58._4_4_ + auVar61._4_4_;
          auVar169._8_4_ = auVar58._8_4_ + auVar61._8_4_;
          auVar169._12_4_ = auVar58._12_4_ + auVar61._12_4_;
          auVar180._0_4_ = auVar66._0_4_ + auVar61._0_4_;
          auVar180._4_4_ = auVar66._4_4_ + auVar61._4_4_;
          auVar180._8_4_ = auVar66._8_4_ + auVar61._8_4_;
          auVar180._12_4_ = auVar66._12_4_ + auVar61._12_4_;
          auVar58 = vmaxps_avx(auVar147,auVar169);
          auVar66 = vminps_avx(auVar180,auVar56);
          uVar38 = vcmpps_avx512vl(auVar66,auVar58,1);
          local_378 = vinsertps_avx(auVar148,auVar149,0x10);
          auVar244 = ZEXT1664(local_378);
          auVar58 = ZEXT416(5);
          if ((uVar38 & 3) == 0) {
            vucomiss_avx512f(auVar44);
            auVar58 = vxorps_avx512vl(auVar58,auVar58);
            auVar252 = ZEXT1664(auVar58);
            if ((uint)uVar33 < 4 && (uVar7 == 0 || lVar36 == 0)) {
              bVar16 = false;
            }
            else {
              lVar36 = 200;
              do {
                auVar66 = vsubss_avx512f(auVar45,auVar61);
                fVar206 = auVar66._0_4_;
                fVar194 = fVar206 * fVar206 * fVar206;
                fVar207 = auVar61._0_4_;
                fVar205 = fVar207 * 3.0 * fVar206 * fVar206;
                fVar206 = fVar206 * fVar207 * fVar207 * 3.0;
                auVar145._4_4_ = fVar194;
                auVar145._0_4_ = fVar194;
                auVar145._8_4_ = fVar194;
                auVar145._12_4_ = fVar194;
                auVar138._4_4_ = fVar205;
                auVar138._0_4_ = fVar205;
                auVar138._8_4_ = fVar205;
                auVar138._12_4_ = fVar205;
                auVar111._4_4_ = fVar206;
                auVar111._0_4_ = fVar206;
                auVar111._8_4_ = fVar206;
                auVar111._12_4_ = fVar206;
                fVar207 = fVar207 * fVar207 * fVar207;
                auVar152._0_4_ = (float)local_358._0_4_ * fVar207;
                auVar152._4_4_ = (float)local_358._4_4_ * fVar207;
                auVar152._8_4_ = fStack_350 * fVar207;
                auVar152._12_4_ = fStack_34c * fVar207;
                auVar66 = vfmadd231ps_fma(auVar152,auVar4,auVar111);
                auVar66 = vfmadd231ps_fma(auVar66,auVar52,auVar138);
                auVar66 = vfmadd231ps_fma(auVar66,auVar3,auVar145);
                auVar112._8_8_ = auVar66._0_8_;
                auVar112._0_8_ = auVar66._0_8_;
                auVar66 = vshufpd_avx(auVar66,auVar66,3);
                auVar56 = vshufps_avx(auVar61,auVar61,0x55);
                auVar66 = vsubps_avx(auVar66,auVar112);
                auVar56 = vfmadd213ps_fma(auVar66,auVar56,auVar112);
                fVar194 = auVar56._0_4_;
                auVar66 = vshufps_avx(auVar56,auVar56,0x55);
                auVar113._0_4_ = auVar46._0_4_ * fVar194 + fVar101 * auVar66._0_4_;
                auVar113._4_4_ = auVar46._4_4_ * fVar194 + auVar50._4_4_ * auVar66._4_4_;
                auVar113._8_4_ = auVar46._8_4_ * fVar194 + auVar50._8_4_ * auVar66._8_4_;
                auVar113._12_4_ = auVar46._12_4_ * fVar194 + auVar50._12_4_ * auVar66._12_4_;
                auVar61 = vsubps_avx(auVar61,auVar113);
                auVar66 = vandps_avx512vl(auVar56,auVar247._0_16_);
                auVar56 = vprolq_avx512vl(auVar66,0x20);
                auVar66 = vmaxss_avx(auVar56,auVar66);
                bVar42 = auVar66._0_4_ <= (float)local_368._0_4_;
                if (auVar66._0_4_ < (float)local_368._0_4_) {
                  auVar46 = vucomiss_avx512f(auVar58);
                  if (bVar42) {
                    auVar45 = vucomiss_avx512f(auVar46);
                    auVar248 = ZEXT1664(auVar45);
                    if (bVar42) {
                      vmovshdup_avx(auVar46);
                      auVar45 = vucomiss_avx512f(auVar58);
                      if (bVar42) {
                        auVar50 = vucomiss_avx512f(auVar45);
                        auVar248 = ZEXT1664(auVar50);
                        if (bVar42) {
                          auVar66 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar60 = vinsertps_avx(auVar66,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar66 = vdpps_avx(auVar60,local_178,0x7f);
                          auVar56 = vdpps_avx(auVar60,local_188,0x7f);
                          auVar57 = vdpps_avx(auVar60,local_198,0x7f);
                          auVar63 = vdpps_avx(auVar60,local_1a8,0x7f);
                          auVar64 = vdpps_avx(auVar60,local_1b8,0x7f);
                          auVar62 = vdpps_avx(auVar60,local_1c8,0x7f);
                          auVar59 = vdpps_avx(auVar60,local_1d8,0x7f);
                          auVar60 = vdpps_avx(auVar60,local_1e8,0x7f);
                          auVar61 = vsubss_avx512f(auVar50,auVar45);
                          fVar101 = auVar45._0_4_;
                          auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * auVar64._0_4_)),auVar61
                                                    ,auVar66);
                          auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar101)),auVar61
                                                    ,auVar56);
                          auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar101)),auVar61
                                                    ,auVar57);
                          auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * auVar60._0_4_)),auVar61
                                                    ,auVar63);
                          auVar50 = vsubss_avx512f(auVar50,auVar46);
                          auVar170._0_4_ = auVar50._0_4_;
                          fVar101 = auVar170._0_4_ * auVar170._0_4_ * auVar170._0_4_;
                          local_118 = auVar46._0_4_;
                          fVar194 = local_118 * 3.0 * auVar170._0_4_ * auVar170._0_4_;
                          fVar205 = auVar170._0_4_ * local_118 * local_118 * 3.0;
                          fVar207 = local_118 * local_118 * local_118;
                          auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * auVar57._0_4_)),
                                                    ZEXT416((uint)fVar205),auVar56);
                          auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar194),auVar66);
                          auVar45 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar101),auVar45);
                          fVar206 = auVar45._0_4_;
                          if ((fVar210 <= fVar206) &&
                             (fVar208 = *(float *)(ray + k * 4 + 0x80), fVar206 <= fVar208)) {
                            local_108 = vshufps_avx(auVar46,auVar46,0x55);
                            auVar50 = vsubps_avx512vl(auVar43,local_108);
                            fVar209 = local_108._0_4_;
                            auVar190._0_4_ = fVar209 * (float)local_208._0_4_;
                            fVar222 = local_108._4_4_;
                            auVar190._4_4_ = fVar222 * (float)local_208._4_4_;
                            fVar230 = local_108._8_4_;
                            auVar190._8_4_ = fVar230 * fStack_200;
                            fVar231 = local_108._12_4_;
                            auVar190._12_4_ = fVar231 * fStack_1fc;
                            auVar204._0_4_ = fVar209 * (float)local_258._0_4_;
                            auVar204._4_4_ = fVar222 * (float)local_258._4_4_;
                            auVar204._8_4_ = fVar230 * fStack_250;
                            auVar204._12_4_ = fVar231 * fStack_24c;
                            auVar217._0_4_ = fVar209 * (float)local_268._0_4_;
                            auVar217._4_4_ = fVar222 * (float)local_268._4_4_;
                            auVar217._8_4_ = fVar230 * fStack_260;
                            auVar217._12_4_ = fVar231 * fStack_25c;
                            auVar229._0_4_ = fVar209 * (float)local_228._0_4_;
                            auVar229._4_4_ = fVar222 * (float)local_228._4_4_;
                            auVar229._8_4_ = fVar230 * fStack_220;
                            auVar229._12_4_ = fVar231 * fStack_21c;
                            auVar43 = vfmadd231ps_fma(auVar190,auVar50,local_1f8);
                            auVar46 = vfmadd231ps_fma(auVar204,auVar50,local_238);
                            auVar45 = vfmadd231ps_fma(auVar217,auVar50,local_248);
                            auVar50 = vfmadd231ps_fma(auVar229,auVar50,local_218);
                            auVar43 = vsubps_avx(auVar46,auVar43);
                            auVar46 = vsubps_avx(auVar45,auVar46);
                            auVar45 = vsubps_avx(auVar50,auVar45);
                            auVar218._0_4_ = auVar46._0_4_ * local_118;
                            auVar218._4_4_ = auVar46._4_4_ * local_118;
                            auVar218._8_4_ = auVar46._8_4_ * local_118;
                            auVar218._12_4_ = auVar46._12_4_ * local_118;
                            auVar170._4_4_ = auVar170._0_4_;
                            auVar170._8_4_ = auVar170._0_4_;
                            auVar170._12_4_ = auVar170._0_4_;
                            auVar43 = vfmadd231ps_fma(auVar218,auVar170,auVar43);
                            auVar181._0_4_ = auVar45._0_4_ * local_118;
                            auVar181._4_4_ = auVar45._4_4_ * local_118;
                            auVar181._8_4_ = auVar45._8_4_ * local_118;
                            auVar181._12_4_ = auVar45._12_4_ * local_118;
                            auVar46 = vfmadd231ps_fma(auVar181,auVar170,auVar46);
                            auVar182._0_4_ = auVar46._0_4_ * local_118;
                            auVar182._4_4_ = auVar46._4_4_ * local_118;
                            auVar182._8_4_ = auVar46._8_4_ * local_118;
                            auVar182._12_4_ = auVar46._12_4_ * local_118;
                            auVar43 = vfmadd231ps_fma(auVar182,auVar170,auVar43);
                            auVar18._8_4_ = 0x40400000;
                            auVar18._0_8_ = 0x4040000040400000;
                            auVar18._12_4_ = 0x40400000;
                            auVar43 = vmulps_avx512vl(auVar43,auVar18);
                            pGVar8 = (context->scene->geometries).items[uVar39].ptr;
                            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                              bVar42 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar42 = true,
                                    pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar153._0_4_ = fVar207 * (float)local_2b8._0_4_;
                              auVar153._4_4_ = fVar207 * (float)local_2b8._4_4_;
                              auVar153._8_4_ = fVar207 * fStack_2b0;
                              auVar153._12_4_ = fVar207 * fStack_2ac;
                              auVar146._4_4_ = fVar205;
                              auVar146._0_4_ = fVar205;
                              auVar146._8_4_ = fVar205;
                              auVar146._12_4_ = fVar205;
                              auVar46 = vfmadd132ps_fma(auVar146,auVar153,local_2a8);
                              auVar132._4_4_ = fVar194;
                              auVar132._0_4_ = fVar194;
                              auVar132._8_4_ = fVar194;
                              auVar132._12_4_ = fVar194;
                              auVar46 = vfmadd132ps_fma(auVar132,auVar46,local_298);
                              auVar120._4_4_ = fVar101;
                              auVar120._0_4_ = fVar101;
                              auVar120._8_4_ = fVar101;
                              auVar120._12_4_ = fVar101;
                              auVar50 = vfmadd132ps_fma(auVar120,auVar46,local_288);
                              auVar46 = vshufps_avx(auVar50,auVar50,0xc9);
                              auVar45 = vshufps_avx(auVar43,auVar43,0xc9);
                              auVar121._0_4_ = auVar50._0_4_ * auVar45._0_4_;
                              auVar121._4_4_ = auVar50._4_4_ * auVar45._4_4_;
                              auVar121._8_4_ = auVar50._8_4_ * auVar45._8_4_;
                              auVar121._12_4_ = auVar50._12_4_ * auVar45._12_4_;
                              auVar46 = vfmsub231ps_fma(auVar121,auVar43,auVar46);
                              auVar43 = vshufps_avx(auVar46,auVar46,0x55);
                              local_138 = vshufps_avx(auVar46,auVar46,0xaa);
                              local_128 = auVar46._0_4_;
                              local_148[0] = (RTCHitN)auVar43[0];
                              local_148[1] = (RTCHitN)auVar43[1];
                              local_148[2] = (RTCHitN)auVar43[2];
                              local_148[3] = (RTCHitN)auVar43[3];
                              local_148[4] = (RTCHitN)auVar43[4];
                              local_148[5] = (RTCHitN)auVar43[5];
                              local_148[6] = (RTCHitN)auVar43[6];
                              local_148[7] = (RTCHitN)auVar43[7];
                              local_148[8] = (RTCHitN)auVar43[8];
                              local_148[9] = (RTCHitN)auVar43[9];
                              local_148[10] = (RTCHitN)auVar43[10];
                              local_148[0xb] = (RTCHitN)auVar43[0xb];
                              local_148[0xc] = (RTCHitN)auVar43[0xc];
                              local_148[0xd] = (RTCHitN)auVar43[0xd];
                              local_148[0xe] = (RTCHitN)auVar43[0xe];
                              local_148[0xf] = (RTCHitN)auVar43[0xf];
                              uStack_124 = local_128;
                              uStack_120 = local_128;
                              uStack_11c = local_128;
                              fStack_114 = local_118;
                              fStack_110 = local_118;
                              fStack_10c = local_118;
                              local_f8 = local_278._0_8_;
                              uStack_f0 = local_278._8_8_;
                              local_e8 = local_2c8;
                              vpcmpeqd_avx2(ZEXT1632(local_2c8),ZEXT1632(local_2c8));
                              uStack_d4 = context->user->instID[0];
                              local_d8 = uStack_d4;
                              uStack_d0 = uStack_d4;
                              uStack_cc = uStack_d4;
                              uStack_c8 = context->user->instPrimID[0];
                              uStack_c4 = uStack_c8;
                              uStack_c0 = uStack_c8;
                              uStack_bc = uStack_c8;
                              *(float *)(ray + k * 4 + 0x80) = fVar206;
                              local_388 = local_2d8._0_8_;
                              uStack_380 = local_2d8._8_8_;
                              local_308.valid = (int *)&local_388;
                              local_308.geometryUserPtr = pGVar8->userPtr;
                              local_308.context = context->user;
                              local_308.ray = (RTCRayN *)ray;
                              local_308.hit = local_148;
                              local_308.N = 4;
                              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar8->occlusionFilterN)(&local_308);
                                auVar244 = ZEXT1664(local_378);
                                auVar43 = vxorps_avx512vl(auVar58,auVar58);
                                auVar252 = ZEXT1664(auVar43);
                                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar249 = ZEXT1664(auVar43);
                                auVar248 = ZEXT464(0x3f800000);
                                auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar246 = ZEXT3264(auVar73);
                                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar247 = ZEXT1664(auVar43);
                                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                auVar245 = ZEXT1664(auVar43);
                                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar250 = ZEXT1664(auVar43);
                              }
                              auVar43 = auVar252._0_16_;
                              auVar29._8_8_ = uStack_380;
                              auVar29._0_8_ = local_388;
                              uVar38 = vptestmd_avx512vl(auVar29,auVar29);
                              if ((uVar38 & 0xf) == 0) {
                                bVar42 = false;
                              }
                              else {
                                p_Var9 = context->args->filter;
                                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var9)(&local_308);
                                  auVar244 = ZEXT1664(local_378);
                                  auVar43 = vxorps_avx512vl(auVar43,auVar43);
                                  auVar252 = ZEXT1664(auVar43);
                                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar249 = ZEXT1664(auVar43);
                                  auVar248 = ZEXT464(0x3f800000);
                                  auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar246 = ZEXT3264(auVar73);
                                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar247 = ZEXT1664(auVar43);
                                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar245 = ZEXT1664(auVar43);
                                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar250 = ZEXT1664(auVar43);
                                }
                                auVar30._8_8_ = uStack_380;
                                auVar30._0_8_ = local_388;
                                uVar38 = vptestmd_avx512vl(auVar30,auVar30);
                                uVar38 = uVar38 & 0xf;
                                auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar42 = (bool)((byte)uVar38 & 1);
                                bVar12 = (bool)((byte)(uVar38 >> 1) & 1);
                                bVar13 = (bool)((byte)(uVar38 >> 2) & 1);
                                bVar14 = SUB81(uVar38 >> 3,0);
                                *(uint *)(local_308.ray + 0x80) =
                                     (uint)bVar42 * auVar43._0_4_ |
                                     (uint)!bVar42 * *(int *)(local_308.ray + 0x80);
                                *(uint *)(local_308.ray + 0x84) =
                                     (uint)bVar12 * auVar43._4_4_ |
                                     (uint)!bVar12 * *(int *)(local_308.ray + 0x84);
                                *(uint *)(local_308.ray + 0x88) =
                                     (uint)bVar13 * auVar43._8_4_ |
                                     (uint)!bVar13 * *(int *)(local_308.ray + 0x88);
                                *(uint *)(local_308.ray + 0x8c) =
                                     (uint)bVar14 * auVar43._12_4_ |
                                     (uint)!bVar14 * *(int *)(local_308.ray + 0x8c);
                                bVar42 = (byte)uVar38 != 0;
                              }
                              if (!bVar42) {
                                *(float *)(ray + k * 4 + 0x80) = fVar208;
                              }
                            }
                            bVar41 = (bool)(bVar41 | bVar42);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar36 = lVar36 + -1;
              } while (lVar36 != 0);
            }
          }
          else {
            auVar43 = vxorps_avx512vl(ZEXT416(5),auVar58);
            auVar252 = ZEXT1664(auVar43);
          }
        }
      }
    } while (bVar16);
    auVar43 = vinsertps_avx512f(auVar44,auVar51,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }